

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_intersector.cpp
# Opt level: O3

void embree::sse2::InstanceIntersectorKMB<4>::intersect
               (vbool<4> *valid_i,Precalculations *pre,RayHitK<4> *ray,RayQueryContext *context,
               Primitive *prim)

{
  RayHitK<4> *pRVar1;
  Vector *pVVar2;
  Vector *pVVar3;
  Vector *pVVar4;
  Vector *pVVar5;
  Vector *pVVar6;
  BBox1f BVar7;
  int iVar8;
  Instance *pIVar9;
  RTCRayQueryContext *pRVar10;
  AffineSpace3ff *pAVar11;
  AffineSpace3ff *pAVar12;
  AffineSpace3ff *pAVar13;
  long lVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  ulong uVar18;
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined4 uVar25;
  int iVar26;
  RayQueryContext *pRVar27;
  undefined4 unaff_EBP;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  float fVar32;
  float fVar33;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  float extraout_XMM0_Db_05;
  float extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  float extraout_XMM0_Dc_05;
  uint uVar38;
  uint uVar39;
  float extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar37;
  float fVar40;
  undefined1 auVar36 [16];
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  float extraout_XMM0_Dd_05;
  uint uVar41;
  uint uVar42;
  float fVar43;
  float extraout_XMM0_Dd_06;
  float fVar44;
  float fVar54;
  float fVar55;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar56;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar57;
  float fVar63;
  float fVar64;
  float fVar65;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar66;
  float fVar72;
  float fVar73;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar74;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar75;
  uint uVar76;
  float fVar80;
  float fVar82;
  undefined1 in_XMM4 [16];
  float fVar84;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  uint uVar81;
  uint uVar83;
  uint uVar85;
  undefined1 auVar79 [16];
  float fVar86;
  float fVar98;
  float fVar99;
  undefined1 in_XMM5 [16];
  float fVar100;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  uint uVar101;
  uint uVar134;
  uint uVar135;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  uint uVar136;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  int iVar137;
  float fVar138;
  int iVar142;
  float fVar143;
  int iVar145;
  float fVar146;
  int iVar149;
  float fVar150;
  undefined1 auVar139 [16];
  float fVar144;
  float fVar147;
  float fVar148;
  float fVar151;
  float fVar152;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  float fVar153;
  float fVar157;
  float fVar158;
  undefined1 in_XMM8 [16];
  float fVar159;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  undefined1 in_XMM9 [16];
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar176;
  float fVar177;
  undefined1 in_XMM10 [16];
  float fVar179;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  float fVar178;
  undefined1 auVar175 [16];
  float fVar180;
  float fVar186;
  float fVar188;
  undefined1 in_XMM11 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  float fVar187;
  float fVar189;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  float fVar190;
  float fVar191;
  float fVar195;
  float fVar197;
  undefined1 in_XMM12 [16];
  float fVar201;
  undefined1 auVar192 [16];
  float fVar196;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar202;
  float fVar203;
  float fVar204;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 in_XMM13 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 in_XMM14 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  float fVar236;
  float fVar237;
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar242;
  undefined1 auVar238 [16];
  float fVar243;
  float fVar244;
  RayQueryContext newcontext;
  undefined1 local_2d8 [8];
  undefined8 uStack_2d0;
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  undefined1 local_2b8 [8];
  undefined8 uStack_2b0;
  undefined1 local_2a8 [8];
  undefined8 uStack_2a0;
  undefined1 local_298 [8];
  undefined8 uStack_290;
  undefined1 local_288 [8];
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [8];
  undefined8 uStack_260;
  undefined1 local_258 [8];
  undefined8 uStack_250;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [8];
  float fStack_1c0;
  float fStack_1bc;
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [8];
  float fStack_1a0;
  float fStack_19c;
  undefined1 local_198 [8];
  float fStack_190;
  float fStack_18c;
  undefined1 local_188 [8];
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [8];
  float fStack_170;
  float fStack_16c;
  undefined1 local_168 [8];
  float fStack_160;
  float fStack_15c;
  undefined1 local_158 [8];
  float fStack_150;
  float fStack_14c;
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  undefined8 local_128;
  undefined8 uStack_120;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  undefined8 local_108;
  undefined8 uStack_100;
  RTCIntersectArguments *local_f8;
  float local_e8;
  float local_d8;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [8];
  float fStack_a0;
  float fStack_9c;
  undefined1 local_98 [8];
  float fStack_90;
  float fStack_8c;
  undefined1 local_88 [8];
  float fStack_80;
  float fStack_7c;
  undefined1 local_78 [8];
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [8];
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [8];
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [8];
  float fStack_40;
  float fStack_3c;
  undefined8 local_38;
  undefined8 uStack_30;
  
  pIVar9 = prim->instance;
  uVar28 = (pIVar9->super_Geometry).mask;
  auVar45._0_4_ = -(uint)((uVar28 & *(uint *)(ray + 0x90)) == 0);
  auVar45._4_4_ = -(uint)((uVar28 & *(uint *)(ray + 0x94)) == 0);
  auVar45._8_4_ = -(uint)((uVar28 & *(uint *)(ray + 0x98)) == 0);
  auVar45._12_4_ = -(uint)((uVar28 & *(uint *)(ray + 0x9c)) == 0);
  auVar45 = ~auVar45 & (undefined1  [16])valid_i->field_0;
  uVar28 = movmskps(unaff_EBP,auVar45);
  if ((uVar28 != 0) && (pRVar10 = context->user, pRVar10->instID[0] == 0xffffffff)) {
    pRVar10->instID[0] = prim->instID_;
    pRVar10->instPrimID[0] = 0;
    if ((pIVar9->super_Geometry).field_8.field_0x1 == '\x01') {
      BVar7 = (pIVar9->super_Geometry).time_range;
      fVar32 = BVar7.lower;
      auVar48._0_4_ = BVar7.upper - fVar32;
      fVar33 = (pIVar9->super_Geometry).fnumTimeSegments;
      _local_2c8 = ZEXT416((uint)fVar33);
      auVar103._0_4_ = *(float *)(ray + 0x70) - fVar32;
      auVar103._4_4_ = *(float *)(ray + 0x74) - fVar32;
      auVar103._8_4_ = *(float *)(ray + 0x78) - fVar32;
      auVar103._12_4_ = *(float *)(ray + 0x7c) - fVar32;
      auVar48._4_4_ = auVar48._0_4_;
      auVar48._8_4_ = auVar48._0_4_;
      auVar48._12_4_ = auVar48._0_4_;
      auVar68 = divps(auVar103,auVar48);
      fVar161 = auVar68._0_4_ * fVar33;
      fVar164 = auVar68._4_4_ * fVar33;
      fVar170 = auVar68._8_4_ * fVar33;
      fVar37 = auVar68._12_4_ * fVar33;
      pRVar27 = context;
      local_2b8._0_4_ = floorf(fVar170);
      uVar25 = SUB84(pRVar27,0);
      local_2b8._4_4_ = extraout_XMM0_Db_02;
      uStack_2b0._0_4_ = (float)extraout_XMM0_Dc_02;
      uStack_2b0._4_4_ = (float)extraout_XMM0_Dd_02;
      local_298._0_4_ = floorf(fVar37);
      local_298._4_4_ = extraout_XMM0_Db_03;
      uStack_290._0_4_ = (float)extraout_XMM0_Dc_03;
      uStack_290._4_4_ = (float)extraout_XMM0_Dd_03;
      local_2a8._0_4_ = floorf(fVar161);
      local_2a8._4_4_ = extraout_XMM0_Db_04;
      uStack_2a0._0_4_ = (float)extraout_XMM0_Dc_04;
      uStack_2a0._4_4_ = (float)extraout_XMM0_Dd_04;
      fVar32 = floorf(fVar164);
      auVar78._4_4_ = fVar32;
      auVar78._0_4_ = local_2a8._0_4_;
      auVar78._8_4_ = local_2b8._0_4_;
      auVar78._12_4_ = local_298._0_4_;
      auVar68._0_4_ = fVar33 + -1.0;
      auVar68._4_4_ = auVar68._0_4_;
      auVar68._8_4_ = auVar68._0_4_;
      auVar68._12_4_ = auVar68._0_4_;
      auVar68 = minps(auVar78,auVar68);
      auVar68 = maxps(auVar68,ZEXT816(0));
      fVar161 = fVar161 - auVar68._0_4_;
      fVar164 = fVar164 - auVar68._4_4_;
      fVar170 = fVar170 - auVar68._8_4_;
      fVar37 = fVar37 - auVar68._12_4_;
      iVar137 = (int)auVar68._0_4_;
      iVar142 = (int)auVar68._4_4_;
      iVar145 = (int)auVar68._8_4_;
      iVar149 = (int)auVar68._12_4_;
      local_108 = CONCAT44(iVar142,iVar137);
      uStack_100 = (RTCRayQueryContext *)CONCAT44(iVar149,iVar145);
      lVar14 = 0;
      if ((uVar28 & 0xff) != 0) {
        for (; ((uVar28 & 0xff) >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
        }
      }
      iVar8 = *(int *)((long)&local_108 + lVar14 * 4);
      auVar174._0_4_ = -(uint)(iVar8 == iVar137);
      auVar174._4_4_ = -(uint)(iVar8 == iVar142);
      auVar174._8_4_ = -(uint)(iVar8 == iVar145);
      auVar174._12_4_ = -(uint)(iVar8 == iVar149);
      auVar68 = ~auVar174 & auVar45;
      iVar26 = movmskps(uVar25,auVar68);
      if (iVar26 == 0) {
        pAVar12 = pIVar9->local2world;
        pAVar13 = pAVar12 + iVar8;
        fVar64 = (pAVar13->l).vx.field_0.m128[1];
        fVar65 = (pAVar13->l).vx.field_0.m128[2];
        local_68._4_4_ = (pAVar13->l).vx.field_0.m128[3];
        pVVar2 = &pAVar12[iVar8].p;
        fVar66 = (pVVar2->field_0).m128[1];
        fVar72 = (pVVar2->field_0).m128[2];
        local_78._4_4_ = *(float *)((long)&pVVar2->field_0 + 0xc);
        local_68._0_4_ = local_68._4_4_;
        fStack_60 = (float)local_68._4_4_;
        fStack_5c = (float)local_68._4_4_;
        local_78._0_4_ = local_78._4_4_;
        fStack_70 = (float)local_78._4_4_;
        fStack_6c = (float)local_78._4_4_;
        pAVar11 = pAVar12 + (long)iVar8 + 1;
        fVar73 = (pAVar11->l).vx.field_0.m128[1];
        fVar74 = (pAVar11->l).vx.field_0.m128[2];
        fVar33 = (pAVar11->l).vx.field_0.m128[3];
        pVVar3 = &pAVar12[(long)iVar8 + 1].p;
        local_48._4_4_ = *(undefined4 *)((long)&pVVar3->field_0 + 4);
        fVar82 = (pVVar3->field_0).m128[2];
        fVar32 = *(float *)((long)&pVVar3->field_0 + 0xc);
        pVVar4 = &pAVar12[iVar8].l.vy;
        fVar84 = (pVVar4->field_0).m128[1];
        fVar138 = (pVVar4->field_0).m128[2];
        local_58._4_4_ = *(float *)((long)&pVVar4->field_0 + 0xc);
        local_58._0_4_ = local_58._4_4_;
        fStack_50 = (float)local_58._4_4_;
        fStack_4c = (float)local_58._4_4_;
        pVVar5 = &pAVar12[(long)iVar8 + 1].l.vy;
        fVar143 = (pVVar5->field_0).m128[1];
        fVar146 = (pVVar5->field_0).m128[2];
        fVar40 = *(float *)((long)&pVVar5->field_0 + 0xc);
        pVVar6 = &pAVar12[iVar8].l.vz;
        fVar150 = (pVVar6->field_0).m128[0];
        fVar153 = (pVVar6->field_0).m128[1];
        fVar157 = (pVVar6->field_0).m128[2];
        local_88._4_4_ = (pVVar6->field_0).m128[3];
        local_88._0_4_ = local_88._4_4_;
        fStack_80 = (float)local_88._4_4_;
        fStack_7c = (float)local_88._4_4_;
        pVVar6 = &pAVar12[(long)iVar8 + 1].l.vz;
        fVar158 = (pVVar6->field_0).m128[1];
        fVar159 = (pVVar6->field_0).m128[2];
        fVar56 = *(float *)((long)&pVVar6->field_0 + 0xc);
        auVar87._0_4_ =
             (float)local_88._4_4_ * fVar56 +
             (float)local_58._4_4_ * fVar40 +
             (float)local_68._4_4_ * fVar33 + (float)local_78._4_4_ * fVar32;
        auVar87._4_4_ =
             (float)local_88._4_4_ * fVar56 +
             (float)local_58._4_4_ * fVar40 +
             (float)local_68._4_4_ * fVar33 + (float)local_78._4_4_ * fVar32;
        auVar87._8_4_ =
             (float)local_88._4_4_ * fVar56 +
             (float)local_58._4_4_ * fVar40 +
             (float)local_68._4_4_ * fVar33 + (float)local_78._4_4_ * fVar32;
        auVar87._12_4_ =
             (float)local_88._4_4_ * fVar56 +
             (float)local_58._4_4_ * fVar40 +
             (float)local_68._4_4_ * fVar33 + (float)local_78._4_4_ * fVar32;
        uVar18 = CONCAT44(auVar87._4_4_,auVar87._0_4_);
        auVar139._0_8_ = uVar18 ^ 0x8000000080000000;
        auVar139._8_4_ = -auVar87._8_4_;
        auVar139._12_4_ = -auVar87._12_4_;
        uVar28 = -(uint)(-auVar87._0_4_ <= auVar87._0_4_);
        uVar29 = -(uint)(-auVar87._4_4_ <= auVar87._4_4_);
        uVar30 = -(uint)(auVar139._8_4_ <= auVar87._8_4_);
        uVar31 = -(uint)(auVar139._12_4_ <= auVar87._12_4_);
        local_a8._4_4_ = (uint)fVar32 & uVar29 | ~uVar29 & (uint)-fVar32;
        local_a8._0_4_ = (uint)fVar32 & uVar28 | ~uVar28 & (uint)-fVar32;
        fStack_a0 = (float)((uint)fVar32 & uVar30 | ~uVar30 & (uint)-fVar32);
        fStack_9c = (float)((uint)fVar32 & uVar31 | ~uVar31 & (uint)-fVar32);
        fVar75 = (float)((uint)fVar33 & uVar28 | ~uVar28 & (uint)-fVar33);
        fVar80 = (float)((uint)fVar33 & uVar29 | ~uVar29 & (uint)-fVar33);
        fVar57 = (float)((uint)fVar33 & uVar30 | ~uVar30 & (uint)-fVar33);
        fVar63 = (float)((uint)fVar33 & uVar31 | ~uVar31 & (uint)-fVar33);
        local_98._4_4_ = (uint)fVar40 & uVar29 | ~uVar29 & (uint)-fVar40;
        local_98._0_4_ = (uint)fVar40 & uVar28 | ~uVar28 & (uint)-fVar40;
        fStack_90 = (float)((uint)fVar40 & uVar30 | ~uVar30 & (uint)-fVar40);
        fStack_8c = (float)((uint)fVar40 & uVar31 | ~uVar31 & (uint)-fVar40);
        auVar48 = maxps(auVar139,auVar87);
        fVar201 = ABS(auVar87._0_4_);
        fVar44 = ABS(auVar87._4_4_);
        fVar54 = ABS(auVar87._8_4_);
        fVar55 = ABS(auVar87._12_4_);
        fVar33 = (float)(~uVar28 & (uint)-fVar56 | (uint)fVar56 & uVar28);
        fVar40 = (float)(~uVar29 & (uint)-fVar56 | (uint)fVar56 & uVar29);
        fVar167 = (float)(~uVar30 & (uint)-fVar56 | (uint)fVar56 & uVar30);
        fVar243 = (float)(~uVar31 & (uint)-fVar56 | (uint)fVar56 & uVar31);
        auVar50._0_4_ = 1.0 - fVar201;
        auVar50._4_4_ = 1.0 - fVar44;
        auVar50._8_4_ = 1.0 - fVar54;
        auVar50._12_4_ = 1.0 - fVar55;
        auVar68 = sqrtps(auVar50,auVar50);
        fVar32 = 1.5707964 -
                 auVar68._0_4_ *
                 (((((fVar201 * -0.0043095737 + 0.0192803) * fVar201 + -0.04489909) * fVar201 +
                   0.08785567) * fVar201 + -0.21450998) * fVar201 + 1.5707952);
        fVar56 = 1.5707964 -
                 auVar68._4_4_ *
                 (((((fVar44 * -0.0043095737 + 0.0192803) * fVar44 + -0.04489909) * fVar44 +
                   0.08785567) * fVar44 + -0.21450998) * fVar44 + 1.5707952);
        fVar236 = 1.5707964 -
                  auVar68._8_4_ *
                  (((((fVar54 * -0.0043095737 + 0.0192803) * fVar54 + -0.04489909) * fVar54 +
                    0.08785567) * fVar54 + -0.21450998) * fVar54 + 1.5707952);
        fVar43 = 1.5707964 -
                 auVar68._12_4_ *
                 (((((fVar55 * -0.0043095737 + 0.0192803) * fVar55 + -0.04489909) * fVar55 +
                   0.08785567) * fVar55 + -0.21450998) * fVar55 + 1.5707952);
        uVar28 = -(uint)(0.0 <= fVar32) & (uint)fVar32;
        uVar29 = -(uint)(0.0 <= fVar56) & (uint)fVar56;
        uVar30 = -(uint)(0.0 <= fVar236) & (uint)fVar236;
        uVar31 = -(uint)(0.0 <= fVar43) & (uint)fVar43;
        fVar190 = auVar48._0_4_;
        fVar239 = auVar48._4_4_;
        fVar178 = auVar48._8_4_;
        fVar187 = auVar48._12_4_;
        local_2a8._0_4_ = SUB124(*(undefined1 (*) [12])&(pAVar13->l).vx.field_0,0);
        local_268._0_4_ = SUB124(*(undefined1 (*) [12])&pVVar4->field_0,0);
        local_258._0_4_ = SUB124(*(undefined1 (*) [12])&pVVar2->field_0,0);
        local_178._0_4_ = SUB124(*(undefined1 (*) [12])&(pAVar11->l).vx.field_0,0);
        local_158._0_4_ = SUB124(*(undefined1 (*) [12])&pVVar5->field_0,0);
        local_1d8._0_4_ = SUB124(*(undefined1 (*) [12])&pVVar6->field_0,0);
        local_188._0_4_ = SUB124(*(undefined1 (*) [12])&pVVar3->field_0,0);
        local_48._0_4_ = local_48._4_4_;
        fStack_40 = (float)local_48._4_4_;
        fStack_3c = (float)local_48._4_4_;
        local_c8 = (float)(~-(uint)(fVar201 <= 1.0) & 0x7fc00000 |
                          (uint)(1.5707964 -
                                (float)(~-(uint)(0.0 <= fVar190) & (uVar28 ^ 0x80000000) |
                                       uVar28 & -(uint)(0.0 <= fVar190))) & -(uint)(fVar201 <= 1.0))
                   * fVar161;
        fStack_c4 = (float)(~-(uint)(fVar44 <= 1.0) & 0x7fc00000 |
                           (uint)(1.5707964 -
                                 (float)(~-(uint)(0.0 <= fVar239) & (uVar29 ^ 0x80000000) |
                                        uVar29 & -(uint)(0.0 <= fVar239))) & -(uint)(fVar44 <= 1.0))
                    * fVar164;
        fStack_c0 = (float)(~-(uint)(fVar54 <= 1.0) & 0x7fc00000 |
                           (uint)(1.5707964 -
                                 (float)(~-(uint)(0.0 <= fVar178) & (uVar30 ^ 0x80000000) |
                                        uVar30 & -(uint)(0.0 <= fVar178))) & -(uint)(fVar54 <= 1.0))
                    * fVar170;
        fStack_bc = (float)(~-(uint)(fVar55 <= 1.0) & 0x7fc00000 |
                           (uint)(1.5707964 -
                                 (float)(~-(uint)(0.0 <= fVar187) & (uVar31 ^ 0x80000000) |
                                        uVar31 & -(uint)(0.0 <= fVar187))) & -(uint)(fVar55 <= 1.0))
                    * fVar37;
        fVar32 = local_c8 * 0.63661975;
        fVar56 = fStack_c4 * 0.63661975;
        fVar236 = fStack_bc * 0.63661975;
        local_b8 = floorf(fStack_c0 * 0.63661975);
        fStack_b4 = extraout_XMM0_Db_05;
        fStack_b0 = extraout_XMM0_Dc_05;
        fStack_ac = extraout_XMM0_Dd_05;
        local_d8 = floorf(fVar236);
        local_e8 = floorf(fVar32);
        fVar32 = floorf(fVar56);
        uVar28 = (uint)local_e8;
        uVar30 = (uint)fVar32;
        uVar38 = (uint)local_b8;
        uVar41 = (uint)local_d8;
        fVar56 = local_c8 - local_e8 * 1.5707964;
        fVar32 = fStack_c4 - fVar32 * 1.5707964;
        auVar154._4_4_ = fVar32;
        auVar154._0_4_ = fVar56;
        fVar236 = fStack_c0 - local_b8 * 1.5707964;
        fVar43 = fStack_bc - local_d8 * 1.5707964;
        auVar154._8_4_ = fVar236;
        auVar154._12_4_ = fVar43;
        fVar201 = fVar56 * fVar56;
        fVar44 = fVar32 * fVar32;
        fVar54 = fVar236 * fVar236;
        fVar55 = fVar43 * fVar43;
        uVar101 = -(uint)(1 < (uVar28 & 3));
        uVar134 = -(uint)(1 < (uVar30 & 3));
        uVar135 = -(uint)(1 < (uVar38 & 3));
        uVar136 = -(uint)(1 < (uVar41 & 3));
        fVar56 = (((((fVar201 * -2.5029328e-08 + 2.7600126e-06) * fVar201 + -0.00019842605) *
                    fVar201 + 0.008333348) * fVar201 + -0.16666667) * fVar201 + 1.0) * fVar56;
        fVar32 = (((((fVar44 * -2.5029328e-08 + 2.7600126e-06) * fVar44 + -0.00019842605) * fVar44 +
                   0.008333348) * fVar44 + -0.16666667) * fVar44 + 1.0) * fVar32;
        fVar236 = (((((fVar54 * -2.5029328e-08 + 2.7600126e-06) * fVar54 + -0.00019842605) * fVar54
                    + 0.008333348) * fVar54 + -0.16666667) * fVar54 + 1.0) * fVar236;
        fVar43 = (((((fVar55 * -2.5029328e-08 + 2.7600126e-06) * fVar55 + -0.00019842605) * fVar55 +
                   0.008333348) * fVar55 + -0.16666667) * fVar55 + 1.0) * fVar43;
        uVar29 = -(uint)((uVar28 & 1) == 0);
        uVar31 = -(uint)((uVar30 & 1) == 0);
        uVar39 = -(uint)((uVar38 & 1) == 0);
        uVar42 = -(uint)((uVar41 & 1) == 0);
        fVar201 = ((((fVar201 * -2.5963018e-07 + 2.4756235e-05) * fVar201 + -0.001388833) * fVar201
                   + 0.04166664) * fVar201 + -0.5) * fVar201 + 1.0;
        fVar44 = ((((fVar44 * -2.5963018e-07 + 2.4756235e-05) * fVar44 + -0.001388833) * fVar44 +
                  0.04166664) * fVar44 + -0.5) * fVar44 + 1.0;
        fVar54 = ((((fVar54 * -2.5963018e-07 + 2.4756235e-05) * fVar54 + -0.001388833) * fVar54 +
                  0.04166664) * fVar54 + -0.5) * fVar54 + 1.0;
        fVar55 = ((((fVar55 * -2.5963018e-07 + 2.4756235e-05) * fVar55 + -0.001388833) * fVar55 +
                  0.04166664) * fVar55 + -0.5) * fVar55 + 1.0;
        uVar29 = ~uVar29 & (uint)fVar201 | (uint)fVar56 & uVar29;
        uVar31 = ~uVar31 & (uint)fVar44 | (uint)fVar32 & uVar31;
        uVar39 = ~uVar39 & (uint)fVar54 | (uint)fVar236 & uVar39;
        uVar42 = ~uVar42 & (uint)fVar55 | (uint)fVar43 & uVar42;
        uVar76 = (int)(uVar28 << 0x1f) >> 0x1f;
        uVar81 = (int)(uVar30 << 0x1f) >> 0x1f;
        uVar83 = (int)(uVar38 << 0x1f) >> 0x1f;
        uVar85 = (int)(uVar41 << 0x1f) >> 0x1f;
        uVar76 = ~uVar76 & (uint)fVar201 | (uint)fVar56 & uVar76;
        uVar81 = ~uVar81 & (uint)fVar44 | (uint)fVar32 & uVar81;
        uVar83 = ~uVar83 & (uint)fVar54 | (uint)fVar236 & uVar83;
        uVar85 = ~uVar85 & (uint)fVar55 | (uint)fVar43 & uVar85;
        fVar32 = (float)((uVar29 ^ 0x80000000) & uVar101 | ~uVar101 & uVar29);
        fVar56 = (float)((uVar31 ^ 0x80000000) & uVar134 | ~uVar134 & uVar31);
        fVar236 = (float)((uVar39 ^ 0x80000000) & uVar135 | ~uVar135 & uVar39);
        fVar43 = (float)((uVar42 ^ 0x80000000) & uVar136 | ~uVar136 & uVar42);
        uVar28 = -(uint)(0x7ffffffd < (int)((uVar28 & 3) - 3 ^ 0x80000000));
        uVar29 = -(uint)(0x7ffffffd < (int)((uVar30 & 3) - 3 ^ 0x80000000));
        uVar30 = -(uint)(0x7ffffffd < (int)((uVar38 & 3) - 3 ^ 0x80000000));
        uVar31 = -(uint)(0x7ffffffd < (int)((uVar41 & 3) - 3 ^ 0x80000000));
        fVar199 = (float)((uVar76 ^ 0x80000000) & uVar28 | ~uVar28 & uVar76);
        fVar200 = (float)((uVar81 ^ 0x80000000) & uVar29 | ~uVar29 & uVar81);
        fVar203 = (float)((uVar83 ^ 0x80000000) & uVar30 | ~uVar30 & uVar83);
        fVar204 = (float)((uVar85 ^ 0x80000000) & uVar31 | ~uVar31 & uVar85);
        fVar201 = (float)local_78._0_4_ * fVar190 - (float)local_a8._0_4_;
        fVar44 = (float)local_78._4_4_ * fVar239 - (float)local_a8._4_4_;
        fVar54 = fStack_70 * fVar178 - fStack_a0;
        fVar55 = fStack_6c * fVar187 - fStack_9c;
        fVar86 = (float)local_68._0_4_ * fVar190 - fVar75;
        fVar98 = (float)local_68._4_4_ * fVar239 - fVar80;
        fVar99 = fStack_60 * fVar178 - fVar57;
        fVar100 = fStack_5c * fVar187 - fVar63;
        fVar172 = (float)local_58._0_4_ * fVar190 - (float)local_98._0_4_;
        fVar176 = (float)local_58._4_4_ * fVar239 - (float)local_98._4_4_;
        fVar177 = fStack_50 * fVar178 - fStack_90;
        fVar179 = fStack_4c * fVar187 - fStack_8c;
        fVar160 = (float)local_88._0_4_ * fVar190 - fVar33;
        fVar163 = (float)local_88._4_4_ * fVar239 - fVar40;
        fVar166 = fStack_80 * fVar178 - fVar167;
        fVar169 = fStack_7c * fVar187 - fVar243;
        auVar58._0_4_ = fVar160 * fVar160 + fVar172 * fVar172 + fVar86 * fVar86 + fVar201 * fVar201;
        auVar58._4_4_ = fVar163 * fVar163 + fVar176 * fVar176 + fVar98 * fVar98 + fVar44 * fVar44;
        auVar58._8_4_ = fVar166 * fVar166 + fVar177 * fVar177 + fVar99 * fVar99 + fVar54 * fVar54;
        auVar58._12_4_ = fVar169 * fVar169 + fVar179 * fVar179 + fVar100 * fVar100 + fVar55 * fVar55
        ;
        auVar68 = rsqrtps(auVar154,auVar58);
        fVar195 = auVar68._0_4_;
        fVar197 = auVar68._4_4_;
        fVar144 = auVar68._8_4_;
        fVar148 = auVar68._12_4_;
        fVar195 = fVar195 * 1.5 - fVar195 * fVar195 * auVar58._0_4_ * 0.5 * fVar195;
        fVar241 = fVar197 * 1.5 - fVar197 * fVar197 * auVar58._4_4_ * 0.5 * fVar197;
        fVar147 = fVar144 * 1.5 - fVar144 * fVar144 * auVar58._8_4_ * 0.5 * fVar144;
        fVar151 = fVar148 * 1.5 - fVar148 * fVar148 * auVar58._12_4_ * 0.5 * fVar148;
        fVar162 = ((float)local_a8._0_4_ - (float)local_78._0_4_) * fVar161 + (float)local_78._0_4_;
        fVar165 = ((float)local_a8._4_4_ - (float)local_78._4_4_) * fVar164 + (float)local_78._4_4_;
        fVar168 = (fStack_a0 - fStack_70) * fVar170 + fStack_70;
        fVar171 = (fStack_9c - fStack_6c) * fVar37 + fStack_6c;
        fVar197 = (fVar75 - (float)local_68._0_4_) * fVar161 + (float)local_68._0_4_;
        fVar144 = (fVar80 - (float)local_68._4_4_) * fVar164 + (float)local_68._4_4_;
        fVar148 = (fVar57 - fStack_60) * fVar170 + fStack_60;
        fVar152 = (fVar63 - fStack_5c) * fVar37 + fStack_5c;
        fVar191 = ((float)local_98._0_4_ - (float)local_58._0_4_) * fVar161 + (float)local_58._0_4_;
        fVar196 = ((float)local_98._4_4_ - (float)local_58._4_4_) * fVar164 + (float)local_58._4_4_;
        fVar198 = (fStack_90 - fStack_50) * fVar170 + fStack_50;
        fVar202 = (fStack_8c - fStack_4c) * fVar37 + fStack_4c;
        fVar180 = (fVar33 - (float)local_88._0_4_) * fVar161 + (float)local_88._0_4_;
        fVar186 = (fVar40 - (float)local_88._4_4_) * fVar164 + (float)local_88._4_4_;
        fVar188 = (fVar167 - fStack_80) * fVar170 + fStack_80;
        fVar189 = (fVar243 - fStack_7c) * fVar37 + fStack_7c;
        auVar88._0_4_ = fVar191 * fVar191 + fVar197 * fVar197 + fVar162 * fVar162;
        auVar88._4_4_ = fVar196 * fVar196 + fVar144 * fVar144 + fVar165 * fVar165;
        auVar88._8_4_ = fVar198 * fVar198 + fVar148 * fVar148 + fVar168 * fVar168;
        auVar88._12_4_ = fVar202 * fVar202 + fVar152 * fVar152 + fVar171 * fVar171;
        auVar104._0_4_ = fVar180 * fVar180 + auVar88._0_4_;
        auVar104._4_4_ = fVar186 * fVar186 + auVar88._4_4_;
        auVar104._8_4_ = fVar188 * fVar188 + auVar88._8_4_;
        auVar104._12_4_ = fVar189 * fVar189 + auVar88._12_4_;
        auVar68 = rsqrtps(auVar88,auVar104);
        fVar33 = auVar68._0_4_;
        fVar40 = auVar68._4_4_;
        fVar167 = auVar68._8_4_;
        fVar243 = auVar68._12_4_;
        fVar75 = fVar33 * 1.5 - fVar33 * fVar33 * auVar104._0_4_ * 0.5 * fVar33;
        fVar80 = fVar40 * 1.5 - fVar40 * fVar40 * auVar104._4_4_ * 0.5 * fVar40;
        fVar57 = fVar167 * 1.5 - fVar167 * fVar167 * auVar104._8_4_ * 0.5 * fVar167;
        fVar63 = fVar243 * 1.5 - fVar243 * fVar243 * auVar104._12_4_ * 0.5 * fVar243;
        uVar28 = -(uint)(fVar190 <= 0.9995);
        uVar29 = -(uint)(fVar239 <= 0.9995);
        uVar30 = -(uint)(fVar178 <= 0.9995);
        uVar31 = -(uint)(fVar187 <= 0.9995);
        fVar201 = (float)(~uVar28 & (uint)(fVar162 * fVar75) |
                         (uint)((float)local_78._0_4_ * fVar199 - fVar201 * fVar195 * fVar32) &
                         uVar28);
        fVar44 = (float)(~uVar29 & (uint)(fVar165 * fVar80) |
                        (uint)((float)local_78._4_4_ * fVar200 - fVar44 * fVar241 * fVar56) & uVar29
                        );
        fVar54 = (float)(~uVar30 & (uint)(fVar168 * fVar57) |
                        (uint)(fStack_70 * fVar203 - fVar54 * fVar147 * fVar236) & uVar30);
        fVar55 = (float)(~uVar31 & (uint)(fVar171 * fVar63) |
                        (uint)(fStack_6c * fVar204 - fVar55 * fVar151 * fVar43) & uVar31);
        fVar33 = (float)(~uVar28 & (uint)(fVar197 * fVar75) |
                        (uint)((float)local_68._0_4_ * fVar199 - fVar86 * fVar195 * fVar32) & uVar28
                        );
        fVar40 = (float)(~uVar29 & (uint)(fVar144 * fVar80) |
                        (uint)((float)local_68._4_4_ * fVar200 - fVar98 * fVar241 * fVar56) & uVar29
                        );
        fVar167 = (float)(~uVar30 & (uint)(fVar148 * fVar57) |
                         (uint)(fStack_60 * fVar203 - fVar99 * fVar147 * fVar236) & uVar30);
        fVar243 = (float)(~uVar31 & (uint)(fVar152 * fVar63) |
                         (uint)(fStack_5c * fVar204 - fVar100 * fVar151 * fVar43) & uVar31);
        fVar86 = (float)(~uVar28 & (uint)(fVar191 * fVar75) |
                        (uint)((float)local_58._0_4_ * fVar199 - fVar172 * fVar195 * fVar32) &
                        uVar28);
        fVar98 = (float)(~uVar29 & (uint)(fVar196 * fVar80) |
                        (uint)((float)local_58._4_4_ * fVar200 - fVar176 * fVar241 * fVar56) &
                        uVar29);
        fVar99 = (float)(~uVar30 & (uint)(fVar198 * fVar57) |
                        (uint)(fStack_50 * fVar203 - fVar177 * fVar147 * fVar236) & uVar30);
        fVar100 = (float)(~uVar31 & (uint)(fVar202 * fVar63) |
                         (uint)(fStack_4c * fVar204 - fVar179 * fVar151 * fVar43) & uVar31);
        fVar32 = (float)(~uVar28 & (uint)(fVar75 * fVar180) |
                        (uint)(fVar199 * (float)local_88._0_4_ - fVar195 * fVar160 * fVar32) &
                        uVar28);
        fVar56 = (float)(~uVar29 & (uint)(fVar80 * fVar186) |
                        (uint)(fVar200 * (float)local_88._4_4_ - fVar241 * fVar163 * fVar56) &
                        uVar29);
        fVar236 = (float)(~uVar30 & (uint)(fVar57 * fVar188) |
                         (uint)(fVar203 * fStack_80 - fVar147 * fVar166 * fVar236) & uVar30);
        fVar43 = (float)(~uVar31 & (uint)(fVar63 * fVar189) |
                        (uint)(fVar204 * fStack_7c - fVar151 * fVar169 * fVar43) & uVar31);
        fVar160 = 1.0 - fVar161;
        fVar163 = 1.0 - fVar164;
        fVar166 = 1.0 - fVar170;
        fVar169 = 1.0 - fVar37;
        fVar75 = (float)local_2a8._0_4_ * fVar160 + (float)local_178._0_4_ * fVar161;
        fVar80 = (float)local_2a8._0_4_ * fVar163 + (float)local_178._0_4_ * fVar164;
        fVar57 = (float)local_2a8._0_4_ * fVar166 + (float)local_178._0_4_ * fVar170;
        fVar63 = (float)local_2a8._0_4_ * fVar169 + (float)local_178._0_4_ * fVar37;
        local_2b8._4_4_ = fVar64 * fVar163 + fVar73 * fVar164;
        local_2b8._0_4_ = fVar64 * fVar160 + fVar73 * fVar161;
        uStack_2b0._0_4_ = fVar64 * fVar166 + fVar73 * fVar170;
        uStack_2b0._4_4_ = fVar64 * fVar169 + fVar73 * fVar37;
        local_2c8._4_4_ = fVar65 * fVar163 + fVar74 * fVar164;
        local_2c8._0_4_ = fVar65 * fVar160 + fVar74 * fVar161;
        fStack_2c0 = fVar65 * fVar166 + fVar74 * fVar170;
        fStack_2bc = fVar65 * fVar169 + fVar74 * fVar37;
        fVar64 = (float)local_268._0_4_ * fVar166;
        fVar65 = (float)local_268._0_4_ * fVar169;
        local_268._4_4_ = (float)local_268._0_4_ * fVar163 + (float)local_158._0_4_ * fVar164;
        local_268._0_4_ = (float)local_268._0_4_ * fVar160 + (float)local_158._0_4_ * fVar161;
        uStack_260._0_4_ = fVar64 + (float)local_158._0_4_ * fVar170;
        uStack_260._4_4_ = fVar65 + (float)local_158._0_4_ * fVar37;
        local_278._4_4_ = fVar84 * fVar163 + fVar143 * fVar164;
        local_278._0_4_ = fVar84 * fVar160 + fVar143 * fVar161;
        fStack_270 = fVar84 * fVar166 + fVar143 * fVar170;
        fStack_26c = fVar84 * fVar169 + fVar143 * fVar37;
        local_298._4_4_ = fVar138 * fVar163 + fVar146 * fVar164;
        local_298._0_4_ = fVar138 * fVar160 + fVar146 * fVar161;
        uStack_290._0_4_ = fVar138 * fVar166 + fVar146 * fVar170;
        uStack_290._4_4_ = fVar138 * fVar169 + fVar146 * fVar37;
        local_1f8._4_4_ = fVar150 * fVar163 + (float)local_1d8._0_4_ * fVar164;
        local_1f8._0_4_ = fVar150 * fVar160 + (float)local_1d8._0_4_ * fVar161;
        fStack_1f0 = fVar150 * fVar166 + (float)local_1d8._0_4_ * fVar170;
        fStack_1ec = fVar150 * fVar169 + (float)local_1d8._0_4_ * fVar37;
        local_208._4_4_ = fVar153 * fVar163 + fVar158 * fVar164;
        local_208._0_4_ = fVar153 * fVar160 + fVar158 * fVar161;
        fStack_200 = fVar153 * fVar166 + fVar158 * fVar170;
        fStack_1fc = fVar153 * fVar169 + fVar158 * fVar37;
        local_218._4_4_ = fVar157 * fVar163 + fVar159 * fVar164;
        local_218._0_4_ = fVar157 * fVar160 + fVar159 * fVar161;
        fStack_210 = fVar157 * fVar166 + fVar159 * fVar170;
        fStack_20c = fVar157 * fVar169 + fVar159 * fVar37;
        fVar64 = (float)local_258._0_4_ * fVar166;
        fVar65 = (float)local_258._0_4_ * fVar169;
        local_258._4_4_ = (float)local_258._0_4_ * fVar163 + (float)local_188._0_4_ * fVar164;
        local_258._0_4_ = (float)local_258._0_4_ * fVar160 + (float)local_188._0_4_ * fVar161;
        uStack_250._0_4_ = fVar64 + (float)local_188._0_4_ * fVar170;
        uStack_250._4_4_ = fVar65 + (float)local_188._0_4_ * fVar37;
        local_238._4_4_ = fVar66 * fVar163 + (float)local_48._4_4_ * fVar164;
        local_238._0_4_ = fVar66 * fVar160 + (float)local_48._0_4_ * fVar161;
        fStack_230 = fVar66 * fVar166 + fStack_40 * fVar170;
        fStack_22c = fVar66 * fVar169 + fStack_3c * fVar37;
        local_228._4_4_ = fVar163 * fVar72 + fVar82 * fVar164;
        local_228._0_4_ = fVar160 * fVar72 + fVar82 * fVar161;
        fStack_220 = fVar166 * fVar72 + fVar82 * fVar170;
        fStack_21c = fVar169 * fVar72 + fVar82 * fVar37;
      }
      else {
        pAVar13 = pIVar9->local2world;
        auVar48 = auVar45;
        do {
          lVar14 = 0;
          if ((uVar28 & 0xf) != 0) {
            for (; ((uVar28 & 0xf) >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
            }
          }
          iVar8 = *(int *)((long)&local_108 + (long)(int)lVar14 * 4);
          auVar182._0_4_ = -(uint)(iVar8 == iVar137);
          auVar182._4_4_ = -(uint)(iVar8 == iVar142);
          auVar182._8_4_ = -(uint)(iVar8 == iVar145);
          auVar182._12_4_ = -(uint)(iVar8 == iVar149);
          auVar182 = auVar182 & auVar48;
          pAVar11 = pAVar13 + iVar8;
          uVar25 = *(undefined4 *)&(pAVar11->l).vx.field_0;
          uVar15 = *(undefined4 *)((long)&(pAVar11->l).vx.field_0 + 4);
          uVar16 = *(undefined4 *)((long)&(pAVar11->l).vx.field_0 + 8);
          uVar17 = *(undefined4 *)((long)&(pAVar11->l).vx.field_0 + 0xc);
          auVar108._4_4_ = uVar25;
          auVar108._0_4_ = uVar25;
          auVar108._8_4_ = uVar25;
          auVar108._12_4_ = uVar25;
          _local_2a8 = ~auVar182 & _local_2a8 | auVar108 & auVar182;
          auVar109._4_4_ = uVar15;
          auVar109._0_4_ = uVar15;
          auVar109._8_4_ = uVar15;
          auVar109._12_4_ = uVar15;
          _local_2b8 = ~auVar182 & _local_2b8 | auVar109 & auVar182;
          auVar110._4_4_ = uVar16;
          auVar110._0_4_ = uVar16;
          auVar110._8_4_ = uVar16;
          auVar110._12_4_ = uVar16;
          _local_2c8 = ~auVar182 & _local_2c8 | auVar110 & auVar182;
          auVar217._4_4_ = uVar17;
          auVar217._0_4_ = uVar17;
          auVar217._8_4_ = uVar17;
          auVar217._12_4_ = uVar17;
          in_XMM14 = ~auVar182 & in_XMM14 | auVar217 & auVar182;
          pVVar2 = &pAVar13[iVar8].l.vy;
          uVar25 = *(undefined4 *)&pVVar2->field_0;
          uVar15 = *(undefined4 *)((long)&pVVar2->field_0 + 4);
          uVar16 = *(undefined4 *)((long)&pVVar2->field_0 + 8);
          uVar17 = *(undefined4 *)((long)&pVVar2->field_0 + 0xc);
          auVar111._4_4_ = uVar25;
          auVar111._0_4_ = uVar25;
          auVar111._8_4_ = uVar25;
          auVar111._12_4_ = uVar25;
          _local_268 = ~auVar182 & _local_268 | auVar111 & auVar182;
          auVar112._4_4_ = uVar15;
          auVar112._0_4_ = uVar15;
          auVar112._8_4_ = uVar15;
          auVar112._12_4_ = uVar15;
          _local_278 = ~auVar182 & _local_278 | auVar112 & auVar182;
          auVar113._4_4_ = uVar16;
          auVar113._0_4_ = uVar16;
          auVar113._8_4_ = uVar16;
          auVar113._12_4_ = uVar16;
          _local_298 = ~auVar182 & _local_298 | auVar113 & auVar182;
          auVar90._4_4_ = uVar17;
          auVar90._0_4_ = uVar17;
          auVar90._8_4_ = uVar17;
          auVar90._12_4_ = uVar17;
          in_XMM12 = ~auVar182 & in_XMM12 | auVar90 & auVar182;
          pVVar2 = &pAVar13[iVar8].l.vz;
          uVar25 = *(undefined4 *)&pVVar2->field_0;
          uVar15 = *(undefined4 *)((long)&pVVar2->field_0 + 4);
          uVar16 = *(undefined4 *)((long)&pVVar2->field_0 + 8);
          uVar17 = *(undefined4 *)((long)&pVVar2->field_0 + 0xc);
          auVar114._4_4_ = uVar25;
          auVar114._0_4_ = uVar25;
          auVar114._8_4_ = uVar25;
          auVar114._12_4_ = uVar25;
          _local_1f8 = ~auVar182 & _local_1f8 | auVar114 & auVar182;
          auVar115._4_4_ = uVar15;
          auVar115._0_4_ = uVar15;
          auVar115._8_4_ = uVar15;
          auVar115._12_4_ = uVar15;
          _local_208 = ~auVar182 & _local_208 | auVar115 & auVar182;
          auVar116._4_4_ = uVar16;
          auVar116._0_4_ = uVar16;
          auVar116._8_4_ = uVar16;
          auVar116._12_4_ = uVar16;
          _local_218 = ~auVar182 & _local_218 | auVar116 & auVar182;
          auVar91._4_4_ = uVar17;
          auVar91._0_4_ = uVar17;
          auVar91._8_4_ = uVar17;
          auVar91._12_4_ = uVar17;
          in_XMM11 = ~auVar182 & in_XMM11 | auVar91 & auVar182;
          pVVar2 = &pAVar13[iVar8].p;
          uVar25 = *(undefined4 *)&pVVar2->field_0;
          uVar15 = *(undefined4 *)((long)&pVVar2->field_0 + 4);
          uVar16 = *(undefined4 *)((long)&pVVar2->field_0 + 8);
          uVar17 = *(undefined4 *)((long)&pVVar2->field_0 + 0xc);
          auVar117._4_4_ = uVar25;
          auVar117._0_4_ = uVar25;
          auVar117._8_4_ = uVar25;
          auVar117._12_4_ = uVar25;
          _local_258 = ~auVar182 & _local_258 | auVar117 & auVar182;
          auVar118._4_4_ = uVar15;
          auVar118._0_4_ = uVar15;
          auVar118._8_4_ = uVar15;
          auVar118._12_4_ = uVar15;
          _local_238 = ~auVar182 & _local_238 | auVar118 & auVar182;
          auVar119._4_4_ = uVar16;
          auVar119._0_4_ = uVar16;
          auVar119._8_4_ = uVar16;
          auVar119._12_4_ = uVar16;
          _local_288 = ~auVar182 & _local_288 | auVar119 & auVar182;
          auVar92._4_4_ = uVar17;
          auVar92._0_4_ = uVar17;
          auVar92._8_4_ = uVar17;
          auVar92._12_4_ = uVar17;
          in_XMM13 = ~auVar182 & in_XMM13 | auVar92 & auVar182;
          pAVar11 = pAVar13 + (long)iVar8 + 1;
          uVar25 = *(undefined4 *)&(pAVar11->l).vx.field_0;
          uVar15 = *(undefined4 *)((long)&(pAVar11->l).vx.field_0 + 4);
          uVar16 = *(undefined4 *)((long)&(pAVar11->l).vx.field_0 + 8);
          uVar17 = *(undefined4 *)((long)&(pAVar11->l).vx.field_0 + 0xc);
          auVar120._4_4_ = uVar25;
          auVar120._0_4_ = uVar25;
          auVar120._8_4_ = uVar25;
          auVar120._12_4_ = uVar25;
          _local_148 = ~auVar182 & _local_148 | auVar120 & auVar182;
          auVar121._4_4_ = uVar15;
          auVar121._0_4_ = uVar15;
          auVar121._8_4_ = uVar15;
          auVar121._12_4_ = uVar15;
          _local_1b8 = ~auVar182 & _local_1b8 | auVar121 & auVar182;
          auVar122._4_4_ = uVar16;
          auVar122._0_4_ = uVar16;
          auVar122._8_4_ = uVar16;
          auVar122._12_4_ = uVar16;
          _local_1a8 = ~auVar182 & _local_1a8 | auVar122 & auVar182;
          auVar93._4_4_ = uVar17;
          auVar93._0_4_ = uVar17;
          auVar93._8_4_ = uVar17;
          auVar93._12_4_ = uVar17;
          in_XMM10 = ~auVar182 & in_XMM10 | auVar93 & auVar182;
          pVVar2 = &pAVar13[(long)iVar8 + 1].l.vy;
          uVar25 = *(undefined4 *)&pVVar2->field_0;
          uVar15 = *(undefined4 *)((long)&pVVar2->field_0 + 4);
          uVar16 = *(undefined4 *)((long)&pVVar2->field_0 + 8);
          uVar17 = *(undefined4 *)((long)&pVVar2->field_0 + 0xc);
          auVar123._4_4_ = uVar25;
          auVar123._0_4_ = uVar25;
          auVar123._8_4_ = uVar25;
          auVar123._12_4_ = uVar25;
          _local_198 = ~auVar182 & _local_198 | auVar123 & auVar182;
          auVar124._4_4_ = uVar15;
          auVar124._0_4_ = uVar15;
          auVar124._8_4_ = uVar15;
          auVar124._12_4_ = uVar15;
          _local_188 = ~auVar182 & _local_188 | auVar124 & auVar182;
          auVar125._4_4_ = uVar16;
          auVar125._0_4_ = uVar16;
          auVar125._8_4_ = uVar16;
          auVar125._12_4_ = uVar16;
          _local_178 = ~auVar182 & _local_178 | auVar125 & auVar182;
          auVar94._4_4_ = uVar17;
          auVar94._0_4_ = uVar17;
          auVar94._8_4_ = uVar17;
          auVar94._12_4_ = uVar17;
          in_XMM8 = ~auVar182 & in_XMM8 | auVar94 & auVar182;
          pVVar2 = &pAVar13[(long)iVar8 + 1].l.vz;
          uVar25 = *(undefined4 *)&pVVar2->field_0;
          uVar15 = *(undefined4 *)((long)&pVVar2->field_0 + 4);
          uVar16 = *(undefined4 *)((long)&pVVar2->field_0 + 8);
          uVar17 = *(undefined4 *)((long)&pVVar2->field_0 + 0xc);
          auVar126._4_4_ = uVar25;
          auVar126._0_4_ = uVar25;
          auVar126._8_4_ = uVar25;
          auVar126._12_4_ = uVar25;
          _local_168 = ~auVar182 & _local_168 | auVar126 & auVar182;
          auVar127._4_4_ = uVar15;
          auVar127._0_4_ = uVar15;
          auVar127._8_4_ = uVar15;
          auVar127._12_4_ = uVar15;
          _local_158 = ~auVar182 & _local_158 | auVar127 & auVar182;
          auVar128._4_4_ = uVar16;
          auVar128._0_4_ = uVar16;
          auVar128._8_4_ = uVar16;
          auVar128._12_4_ = uVar16;
          _local_1d8 = ~auVar182 & _local_1d8 | auVar128 & auVar182;
          auVar95._4_4_ = uVar17;
          auVar95._0_4_ = uVar17;
          auVar95._8_4_ = uVar17;
          auVar95._12_4_ = uVar17;
          auVar68 = ~auVar182 & auVar68 | auVar95 & auVar182;
          pVVar2 = &pAVar13[(long)iVar8 + 1].p;
          uVar25 = *(undefined4 *)&pVVar2->field_0;
          uVar15 = *(undefined4 *)((long)&pVVar2->field_0 + 4);
          uVar16 = *(undefined4 *)((long)&pVVar2->field_0 + 8);
          uVar17 = *(undefined4 *)((long)&pVVar2->field_0 + 0xc);
          auVar129._4_4_ = uVar25;
          auVar129._0_4_ = uVar25;
          auVar129._8_4_ = uVar25;
          auVar129._12_4_ = uVar25;
          _local_1c8 = ~auVar182 & _local_1c8 | auVar129 & auVar182;
          auVar130._4_4_ = uVar15;
          auVar130._0_4_ = uVar15;
          auVar130._8_4_ = uVar15;
          auVar130._12_4_ = uVar15;
          _local_228 = ~auVar182 & _local_228 | auVar130 & auVar182;
          auVar131._4_4_ = uVar16;
          auVar131._0_4_ = uVar16;
          auVar131._8_4_ = uVar16;
          auVar131._12_4_ = uVar16;
          _local_248 = ~auVar182 & _local_248 | auVar131 & auVar182;
          auVar48 = auVar48 ^ auVar182;
          auVar206._4_4_ = uVar17;
          auVar206._0_4_ = uVar17;
          auVar206._8_4_ = uVar17;
          auVar206._12_4_ = uVar17;
          in_XMM9 = ~auVar182 & in_XMM9 | auVar206 & auVar182;
          uVar28 = movmskps(uVar28,auVar48);
        } while (uVar28 != 0);
        auVar53._0_4_ =
             auVar68._0_4_ * in_XMM11._0_4_ +
             in_XMM8._0_4_ * in_XMM12._0_4_ +
             in_XMM10._0_4_ * in_XMM14._0_4_ + in_XMM9._0_4_ * in_XMM13._0_4_;
        auVar53._4_4_ =
             auVar68._4_4_ * in_XMM11._4_4_ +
             in_XMM8._4_4_ * in_XMM12._4_4_ +
             in_XMM10._4_4_ * in_XMM14._4_4_ + in_XMM9._4_4_ * in_XMM13._4_4_;
        auVar53._8_4_ =
             auVar68._8_4_ * in_XMM11._8_4_ +
             in_XMM8._8_4_ * in_XMM12._8_4_ +
             in_XMM10._8_4_ * in_XMM14._8_4_ + in_XMM9._8_4_ * in_XMM13._8_4_;
        auVar53._12_4_ =
             auVar68._12_4_ * in_XMM11._12_4_ +
             in_XMM8._12_4_ * in_XMM12._12_4_ +
             in_XMM10._12_4_ * in_XMM14._12_4_ + in_XMM9._12_4_ * in_XMM13._12_4_;
        fVar33 = (float)((uint)auVar53._0_4_ ^ (uint)DAT_01f7b6d0);
        fVar32 = (float)((uint)auVar53._4_4_ ^ DAT_01f7b6d0._4_4_);
        auVar194._4_4_ = fVar32;
        auVar194._0_4_ = fVar33;
        fVar40 = (float)((uint)auVar53._8_4_ ^ DAT_01f7b6d0._8_4_);
        fVar56 = (float)((uint)auVar53._12_4_ ^ DAT_01f7b6d0._12_4_);
        uVar28 = -(uint)(fVar33 <= auVar53._0_4_);
        uVar29 = -(uint)(fVar32 <= auVar53._4_4_);
        uVar30 = -(uint)(fVar40 <= auVar53._8_4_);
        uVar31 = -(uint)(fVar56 <= auVar53._12_4_);
        auVar132._4_4_ = uVar29;
        auVar132._0_4_ = uVar28;
        auVar132._8_4_ = uVar30;
        auVar132._12_4_ = uVar31;
        auVar194._8_4_ = fVar40;
        auVar194._12_4_ = fVar56;
        auVar48 = in_XMM9 ^ _DAT_01f7b6d0;
        auVar96._0_4_ = ~uVar28 & auVar48._0_4_;
        auVar96._4_4_ = ~uVar29 & auVar48._4_4_;
        auVar96._8_4_ = ~uVar30 & auVar48._8_4_;
        auVar96._12_4_ = ~uVar31 & auVar48._12_4_;
        _local_98 = in_XMM9 & auVar132 | auVar96;
        auVar48 = in_XMM10 & auVar132 | ~auVar132 & (in_XMM10 ^ _DAT_01f7b6d0);
        _local_88 = in_XMM8 & auVar132 | ~auVar132 & (in_XMM8 ^ _DAT_01f7b6d0);
        auVar78 = maxps(auVar194,auVar53);
        fVar32 = ABS(auVar53._0_4_);
        fVar56 = ABS(auVar53._4_4_);
        fVar236 = ABS(auVar53._8_4_);
        fVar243 = ABS(auVar53._12_4_);
        _local_a8 = ~auVar132 & (auVar68 ^ _DAT_01f7b6d0) | auVar68 & auVar132;
        fVar241 = auVar78._12_4_;
        fVar33 = auVar78._0_4_;
        fVar40 = auVar78._4_4_;
        fVar167 = auVar78._8_4_;
        auVar71._0_4_ = 1.0 - fVar32;
        auVar71._4_4_ = 1.0 - fVar56;
        auVar71._8_4_ = 1.0 - fVar236;
        auVar71._12_4_ = 1.0 - fVar243;
        auVar68 = sqrtps(auVar71,auVar71);
        fVar43 = 1.5707964 -
                 auVar68._0_4_ *
                 (((((fVar32 * -0.0043095737 + 0.0192803) * fVar32 + -0.04489909) * fVar32 +
                   0.08785567) * fVar32 + -0.21450998) * fVar32 + 1.5707952);
        fVar201 = 1.5707964 -
                  auVar68._4_4_ *
                  (((((fVar56 * -0.0043095737 + 0.0192803) * fVar56 + -0.04489909) * fVar56 +
                    0.08785567) * fVar56 + -0.21450998) * fVar56 + 1.5707952);
        fVar44 = 1.5707964 -
                 auVar68._8_4_ *
                 (((((fVar236 * -0.0043095737 + 0.0192803) * fVar236 + -0.04489909) * fVar236 +
                   0.08785567) * fVar236 + -0.21450998) * fVar236 + 1.5707952);
        fVar54 = 1.5707964 -
                 auVar68._12_4_ *
                 (((((fVar243 * -0.0043095737 + 0.0192803) * fVar243 + -0.04489909) * fVar243 +
                   0.08785567) * fVar243 + -0.21450998) * fVar243 + 1.5707952);
        uVar28 = -(uint)(0.0 <= fVar43) & (uint)fVar43;
        uVar29 = -(uint)(0.0 <= fVar201) & (uint)fVar201;
        uVar30 = -(uint)(0.0 <= fVar44) & (uint)fVar44;
        uVar31 = -(uint)(0.0 <= fVar54) & (uint)fVar54;
        local_b8 = (float)(~-(uint)(fVar32 <= 1.0) & 0x7fc00000 |
                          (uint)(1.5707964 -
                                (float)(~-(uint)(0.0 <= fVar33) & (uVar28 ^ (uint)DAT_01f7b6d0) |
                                       uVar28 & -(uint)(0.0 <= fVar33))) & -(uint)(fVar32 <= 1.0)) *
                   fVar161;
        fStack_b4 = (float)(~-(uint)(fVar56 <= 1.0) & 0x7fc00000 |
                           (uint)(1.5707964 -
                                 (float)(~-(uint)(0.0 <= fVar40) & (uVar29 ^ DAT_01f7b6d0._4_4_) |
                                        uVar29 & -(uint)(0.0 <= fVar40))) & -(uint)(fVar56 <= 1.0))
                    * fVar164;
        fStack_b0 = (float)(~-(uint)(fVar236 <= 1.0) & 0x7fc00000 |
                           (uint)(1.5707964 -
                                 (float)(~-(uint)(0.0 <= fVar167) & (uVar30 ^ DAT_01f7b6d0._8_4_) |
                                        uVar30 & -(uint)(0.0 <= fVar167))) & -(uint)(fVar236 <= 1.0)
                           ) * fVar170;
        fStack_ac = (float)(~-(uint)(fVar243 <= 1.0) & 0x7fc00000 |
                           (uint)(1.5707964 -
                                 (float)(~-(uint)(0.0 <= fVar241) & (uVar31 ^ DAT_01f7b6d0._12_4_) |
                                        uVar31 & -(uint)(0.0 <= fVar241))) & -(uint)(fVar243 <= 1.0)
                           ) * fVar37;
        fVar32 = local_b8 * 0.63661975;
        fVar56 = fStack_b4 * 0.63661975;
        fVar236 = fStack_ac * 0.63661975;
        _local_78 = in_XMM13;
        _local_68 = in_XMM14;
        _local_58 = in_XMM12;
        _local_48 = in_XMM11;
        local_c8 = floorf(fStack_b0 * 0.63661975);
        fStack_c4 = extraout_XMM0_Db_06;
        fStack_c0 = extraout_XMM0_Dc_06;
        fStack_bc = extraout_XMM0_Dd_06;
        local_d8 = floorf(fVar236);
        local_e8 = floorf(fVar32);
        fVar32 = floorf(fVar56);
        uVar28 = (uint)local_e8;
        uVar30 = (uint)fVar32;
        uVar38 = (uint)local_c8;
        uVar41 = (uint)local_d8;
        fVar56 = local_b8 - local_e8 * 1.5707964;
        fVar32 = fStack_b4 - fVar32 * 1.5707964;
        auVar156._4_4_ = fVar32;
        auVar156._0_4_ = fVar56;
        fVar236 = fStack_b0 - local_c8 * 1.5707964;
        fVar243 = fStack_ac - local_d8 * 1.5707964;
        auVar156._8_4_ = fVar236;
        auVar156._12_4_ = fVar243;
        fVar43 = fVar56 * fVar56;
        fVar201 = fVar32 * fVar32;
        fVar44 = fVar236 * fVar236;
        fVar54 = fVar243 * fVar243;
        uVar101 = -(uint)(1 < (uVar28 & 3));
        uVar134 = -(uint)(1 < (uVar30 & 3));
        uVar135 = -(uint)(1 < (uVar38 & 3));
        uVar136 = -(uint)(1 < (uVar41 & 3));
        fVar56 = (((((fVar43 * -2.5029328e-08 + 2.7600126e-06) * fVar43 + -0.00019842605) * fVar43 +
                   0.008333348) * fVar43 + -0.16666667) * fVar43 + 1.0) * fVar56;
        fVar32 = (((((fVar201 * -2.5029328e-08 + 2.7600126e-06) * fVar201 + -0.00019842605) *
                    fVar201 + 0.008333348) * fVar201 + -0.16666667) * fVar201 + 1.0) * fVar32;
        fVar236 = (((((fVar44 * -2.5029328e-08 + 2.7600126e-06) * fVar44 + -0.00019842605) * fVar44
                    + 0.008333348) * fVar44 + -0.16666667) * fVar44 + 1.0) * fVar236;
        fVar243 = (((((fVar54 * -2.5029328e-08 + 2.7600126e-06) * fVar54 + -0.00019842605) * fVar54
                    + 0.008333348) * fVar54 + -0.16666667) * fVar54 + 1.0) * fVar243;
        uVar29 = -(uint)((uVar28 & 1) == 0);
        uVar31 = -(uint)((uVar30 & 1) == 0);
        uVar39 = -(uint)((uVar38 & 1) == 0);
        uVar42 = -(uint)((uVar41 & 1) == 0);
        fVar43 = ((((fVar43 * -2.5963018e-07 + 2.4756235e-05) * fVar43 + -0.001388833) * fVar43 +
                  0.04166664) * fVar43 + -0.5) * fVar43 + 1.0;
        fVar201 = ((((fVar201 * -2.5963018e-07 + 2.4756235e-05) * fVar201 + -0.001388833) * fVar201
                   + 0.04166664) * fVar201 + -0.5) * fVar201 + 1.0;
        fVar44 = ((((fVar44 * -2.5963018e-07 + 2.4756235e-05) * fVar44 + -0.001388833) * fVar44 +
                  0.04166664) * fVar44 + -0.5) * fVar44 + 1.0;
        fVar54 = ((((fVar54 * -2.5963018e-07 + 2.4756235e-05) * fVar54 + -0.001388833) * fVar54 +
                  0.04166664) * fVar54 + -0.5) * fVar54 + 1.0;
        uVar29 = ~uVar29 & (uint)fVar43 | (uint)fVar56 & uVar29;
        uVar31 = ~uVar31 & (uint)fVar201 | (uint)fVar32 & uVar31;
        uVar39 = ~uVar39 & (uint)fVar44 | (uint)fVar236 & uVar39;
        uVar42 = ~uVar42 & (uint)fVar54 | (uint)fVar243 & uVar42;
        uVar76 = (int)(uVar28 << 0x1f) >> 0x1f;
        uVar81 = (int)(uVar30 << 0x1f) >> 0x1f;
        uVar83 = (int)(uVar38 << 0x1f) >> 0x1f;
        uVar85 = (int)(uVar41 << 0x1f) >> 0x1f;
        uVar76 = ~uVar76 & (uint)fVar43 | (uint)fVar56 & uVar76;
        uVar81 = ~uVar81 & (uint)fVar201 | (uint)fVar32 & uVar81;
        uVar83 = ~uVar83 & (uint)fVar44 | (uint)fVar236 & uVar83;
        uVar85 = ~uVar85 & (uint)fVar54 | (uint)fVar243 & uVar85;
        fVar32 = (float)((uVar29 ^ 0x80000000) & uVar101 | ~uVar101 & uVar29);
        fVar56 = (float)((uVar31 ^ 0x80000000) & uVar134 | ~uVar134 & uVar31);
        fVar236 = (float)((uVar39 ^ 0x80000000) & uVar135 | ~uVar135 & uVar39);
        fVar43 = (float)((uVar42 ^ 0x80000000) & uVar136 | ~uVar136 & uVar42);
        uVar28 = -(uint)(0x7ffffffd < (int)((uVar28 & 3) - 3 ^ 0x80000000));
        uVar29 = -(uint)(0x7ffffffd < (int)((uVar30 & 3) - 3 ^ 0x80000000));
        uVar30 = -(uint)(0x7ffffffd < (int)((uVar38 & 3) - 3 ^ 0x80000000));
        uVar31 = -(uint)(0x7ffffffd < (int)((uVar41 & 3) - 3 ^ 0x80000000));
        fVar64 = (float)((uVar76 ^ 0x80000000) & uVar28 | ~uVar28 & uVar76);
        fVar65 = (float)((uVar81 ^ 0x80000000) & uVar29 | ~uVar29 & uVar81);
        fVar66 = (float)((uVar83 ^ 0x80000000) & uVar30 | ~uVar30 & uVar83);
        fVar72 = (float)((uVar85 ^ 0x80000000) & uVar31 | ~uVar31 & uVar85);
        fVar243 = fVar33 * (float)local_78._0_4_ - (float)local_98._0_4_;
        fVar44 = fVar40 * (float)local_78._4_4_ - (float)local_98._4_4_;
        fVar54 = fVar167 * fStack_70 - fStack_90;
        fVar55 = fVar241 * fStack_6c - fStack_8c;
        local_118 = auVar48._0_4_;
        fStack_114 = auVar48._4_4_;
        fStack_110 = auVar48._8_4_;
        fStack_10c = auVar48._12_4_;
        fVar86 = fVar33 * (float)local_68._0_4_ - local_118;
        fVar98 = fVar40 * (float)local_68._4_4_ - fStack_114;
        fVar99 = fVar167 * fStack_60 - fStack_110;
        fVar100 = fVar241 * fStack_5c - fStack_10c;
        fVar138 = fVar33 * (float)local_58._0_4_ - (float)local_88._0_4_;
        fVar143 = fVar40 * (float)local_58._4_4_ - (float)local_88._4_4_;
        fVar146 = fVar167 * fStack_50 - fStack_80;
        fVar150 = fVar241 * fStack_4c - fStack_7c;
        fVar73 = fVar33 * (float)local_48._0_4_ - (float)local_a8._0_4_;
        fVar74 = fVar40 * (float)local_48._4_4_ - (float)local_a8._4_4_;
        fVar82 = fVar167 * fStack_40 - fStack_a0;
        fVar84 = fVar241 * fStack_3c - fStack_9c;
        auVar62._0_4_ = fVar73 * fVar73 + fVar138 * fVar138 + fVar86 * fVar86 + fVar243 * fVar243;
        auVar62._4_4_ = fVar74 * fVar74 + fVar143 * fVar143 + fVar98 * fVar98 + fVar44 * fVar44;
        auVar62._8_4_ = fVar82 * fVar82 + fVar146 * fVar146 + fVar99 * fVar99 + fVar54 * fVar54;
        auVar62._12_4_ = fVar84 * fVar84 + fVar150 * fVar150 + fVar100 * fVar100 + fVar55 * fVar55;
        auVar68 = rsqrtps(auVar156,auVar62);
        fVar201 = auVar68._0_4_;
        fVar75 = auVar68._4_4_;
        fVar80 = auVar68._8_4_;
        fVar57 = auVar68._12_4_;
        fVar153 = fVar201 * 1.5 - fVar201 * fVar201 * auVar62._0_4_ * 0.5 * fVar201;
        fVar157 = fVar75 * 1.5 - fVar75 * fVar75 * auVar62._4_4_ * 0.5 * fVar75;
        fVar158 = fVar80 * 1.5 - fVar80 * fVar80 * auVar62._8_4_ * 0.5 * fVar80;
        fVar159 = fVar57 * 1.5 - fVar57 * fVar57 * auVar62._12_4_ * 0.5 * fVar57;
        fVar172 = ((float)local_98._0_4_ - (float)local_78._0_4_) * fVar161 + (float)local_78._0_4_;
        fVar176 = ((float)local_98._4_4_ - (float)local_78._4_4_) * fVar164 + (float)local_78._4_4_;
        fVar177 = (fStack_90 - fStack_70) * fVar170 + fStack_70;
        fVar179 = (fStack_8c - fStack_6c) * fVar37 + fStack_6c;
        fVar160 = (local_118 - (float)local_68._0_4_) * fVar161 + (float)local_68._0_4_;
        fVar163 = (fStack_114 - (float)local_68._4_4_) * fVar164 + (float)local_68._4_4_;
        fVar166 = (fStack_110 - fStack_60) * fVar170 + fStack_60;
        fVar169 = (fStack_10c - fStack_5c) * fVar37 + fStack_5c;
        fVar144 = ((float)local_88._0_4_ - (float)local_58._0_4_) * fVar161 + (float)local_58._0_4_;
        fVar178 = ((float)local_88._4_4_ - (float)local_58._4_4_) * fVar164 + (float)local_58._4_4_;
        fVar147 = (fStack_80 - fStack_50) * fVar170 + fStack_50;
        fVar148 = (fStack_7c - fStack_4c) * fVar37 + fStack_4c;
        fVar190 = ((float)local_a8._0_4_ - (float)local_48._0_4_) * fVar161 + (float)local_48._0_4_;
        fVar195 = ((float)local_a8._4_4_ - (float)local_48._4_4_) * fVar164 + (float)local_48._4_4_;
        fVar197 = (fStack_a0 - fStack_40) * fVar170 + fStack_40;
        fVar239 = (fStack_9c - fStack_3c) * fVar37 + fStack_3c;
        auVar97._0_4_ = fVar144 * fVar144 + fVar160 * fVar160 + fVar172 * fVar172;
        auVar97._4_4_ = fVar178 * fVar178 + fVar163 * fVar163 + fVar176 * fVar176;
        auVar97._8_4_ = fVar147 * fVar147 + fVar166 * fVar166 + fVar177 * fVar177;
        auVar97._12_4_ = fVar148 * fVar148 + fVar169 * fVar169 + fVar179 * fVar179;
        auVar133._0_4_ = fVar190 * fVar190 + auVar97._0_4_;
        auVar133._4_4_ = fVar195 * fVar195 + auVar97._4_4_;
        auVar133._8_4_ = fVar197 * fVar197 + auVar97._8_4_;
        auVar133._12_4_ = fVar239 * fVar239 + auVar97._12_4_;
        auVar68 = rsqrtps(auVar97,auVar133);
        fVar201 = auVar68._0_4_;
        fVar80 = auVar68._4_4_;
        fVar57 = auVar68._8_4_;
        fVar63 = auVar68._12_4_;
        fVar75 = fVar201 * 1.5 - fVar201 * fVar201 * auVar133._0_4_ * 0.5 * fVar201;
        fVar80 = fVar80 * 1.5 - fVar80 * fVar80 * auVar133._4_4_ * 0.5 * fVar80;
        fVar57 = fVar57 * 1.5 - fVar57 * fVar57 * auVar133._8_4_ * 0.5 * fVar57;
        fVar63 = fVar63 * 1.5 - fVar63 * fVar63 * auVar133._12_4_ * 0.5 * fVar63;
        uVar28 = -(uint)(fVar33 <= 0.9995);
        uVar29 = -(uint)(fVar40 <= 0.9995);
        uVar30 = -(uint)(fVar167 <= 0.9995);
        uVar31 = -(uint)(fVar241 <= 0.9995);
        fVar201 = (float)(~uVar28 & (uint)(fVar172 * fVar75) |
                         (uint)(fVar64 * (float)local_78._0_4_ - fVar243 * fVar153 * fVar32) &
                         uVar28);
        fVar44 = (float)(~uVar29 & (uint)(fVar176 * fVar80) |
                        (uint)(fVar65 * (float)local_78._4_4_ - fVar44 * fVar157 * fVar56) & uVar29)
        ;
        fVar54 = (float)(~uVar30 & (uint)(fVar177 * fVar57) |
                        (uint)(fVar66 * fStack_70 - fVar54 * fVar158 * fVar236) & uVar30);
        fVar55 = (float)(~uVar31 & (uint)(fVar179 * fVar63) |
                        (uint)(fVar72 * fStack_6c - fVar55 * fVar159 * fVar43) & uVar31);
        fVar33 = (float)(~uVar28 & (uint)(fVar160 * fVar75) |
                        (uint)(fVar64 * (float)local_68._0_4_ - fVar86 * fVar153 * fVar32) & uVar28)
        ;
        fVar40 = (float)(~uVar29 & (uint)(fVar163 * fVar80) |
                        (uint)(fVar65 * (float)local_68._4_4_ - fVar98 * fVar157 * fVar56) & uVar29)
        ;
        fVar167 = (float)(~uVar30 & (uint)(fVar166 * fVar57) |
                         (uint)(fVar66 * fStack_60 - fVar99 * fVar158 * fVar236) & uVar30);
        fVar243 = (float)(~uVar31 & (uint)(fVar169 * fVar63) |
                         (uint)(fVar72 * fStack_5c - fVar100 * fVar159 * fVar43) & uVar31);
        fVar86 = (float)(~uVar28 & (uint)(fVar144 * fVar75) |
                        (uint)(fVar64 * (float)local_58._0_4_ - fVar138 * fVar153 * fVar32) & uVar28
                        );
        fVar98 = (float)(~uVar29 & (uint)(fVar178 * fVar80) |
                        (uint)(fVar65 * (float)local_58._4_4_ - fVar143 * fVar157 * fVar56) & uVar29
                        );
        fVar99 = (float)(~uVar30 & (uint)(fVar147 * fVar57) |
                        (uint)(fVar66 * fStack_50 - fVar146 * fVar158 * fVar236) & uVar30);
        fVar100 = (float)(~uVar31 & (uint)(fVar148 * fVar63) |
                         (uint)(fVar72 * fStack_4c - fVar150 * fVar159 * fVar43) & uVar31);
        fVar32 = (float)(~uVar28 & (uint)(fVar75 * fVar190) |
                        (uint)(fVar64 * (float)local_48._0_4_ - fVar153 * fVar73 * fVar32) & uVar28)
        ;
        fVar56 = (float)(~uVar29 & (uint)(fVar80 * fVar195) |
                        (uint)(fVar65 * (float)local_48._4_4_ - fVar157 * fVar74 * fVar56) & uVar29)
        ;
        fVar236 = (float)(~uVar30 & (uint)(fVar57 * fVar197) |
                         (uint)(fVar66 * fStack_40 - fVar158 * fVar82 * fVar236) & uVar30);
        fVar43 = (float)(~uVar31 & (uint)(fVar63 * fVar239) |
                        (uint)(fVar72 * fStack_3c - fVar159 * fVar84 * fVar43) & uVar31);
        fVar64 = 1.0 - fVar161;
        fVar65 = 1.0 - fVar164;
        fVar66 = 1.0 - fVar170;
        fVar72 = 1.0 - fVar37;
        fVar75 = (float)local_2a8._0_4_ * fVar64 + (float)local_148._0_4_ * fVar161;
        fVar80 = (float)local_2a8._4_4_ * fVar65 + (float)local_148._4_4_ * fVar164;
        fVar57 = (float)uStack_2a0 * fVar66 + fStack_140 * fVar170;
        fVar63 = uStack_2a0._4_4_ * fVar72 + fStack_13c * fVar37;
        local_2b8._4_4_ = (float)local_2b8._4_4_ * fVar65 + (float)local_1b8._4_4_ * fVar164;
        local_2b8._0_4_ = (float)local_2b8._0_4_ * fVar64 + (float)local_1b8._0_4_ * fVar161;
        uStack_2b0._0_4_ = (float)uStack_2b0 * fVar66 + fStack_1b0 * fVar170;
        uStack_2b0._4_4_ = uStack_2b0._4_4_ * fVar72 + fStack_1ac * fVar37;
        local_2c8._4_4_ = (float)local_2c8._4_4_ * fVar65 + (float)local_1a8._4_4_ * fVar164;
        local_2c8._0_4_ = (float)local_2c8._0_4_ * fVar64 + (float)local_1a8._0_4_ * fVar161;
        fStack_2c0 = fStack_2c0 * fVar66 + fStack_1a0 * fVar170;
        fStack_2bc = fStack_2bc * fVar72 + fStack_19c * fVar37;
        local_268._4_4_ = (float)local_268._4_4_ * fVar65 + (float)local_198._4_4_ * fVar164;
        local_268._0_4_ = (float)local_268._0_4_ * fVar64 + (float)local_198._0_4_ * fVar161;
        uStack_260._0_4_ = (float)uStack_260 * fVar66 + fStack_190 * fVar170;
        uStack_260._4_4_ = uStack_260._4_4_ * fVar72 + fStack_18c * fVar37;
        local_278._4_4_ = (float)local_278._4_4_ * fVar65 + (float)local_188._4_4_ * fVar164;
        local_278._0_4_ = (float)local_278._0_4_ * fVar64 + (float)local_188._0_4_ * fVar161;
        fStack_270 = fStack_270 * fVar66 + fStack_180 * fVar170;
        fStack_26c = fStack_26c * fVar72 + fStack_17c * fVar37;
        local_298._4_4_ = (float)local_298._4_4_ * fVar65 + (float)local_178._4_4_ * fVar164;
        local_298._0_4_ = (float)local_298._0_4_ * fVar64 + (float)local_178._0_4_ * fVar161;
        uStack_290._0_4_ = (float)uStack_290 * fVar66 + fStack_170 * fVar170;
        uStack_290._4_4_ = uStack_290._4_4_ * fVar72 + fStack_16c * fVar37;
        local_1f8._4_4_ = (float)local_1f8._4_4_ * fVar65 + (float)local_168._4_4_ * fVar164;
        local_1f8._0_4_ = (float)local_1f8._0_4_ * fVar64 + (float)local_168._0_4_ * fVar161;
        fStack_1f0 = fStack_1f0 * fVar66 + fStack_160 * fVar170;
        fStack_1ec = fStack_1ec * fVar72 + fStack_15c * fVar37;
        local_208._4_4_ = (float)local_208._4_4_ * fVar65 + (float)local_158._4_4_ * fVar164;
        local_208._0_4_ = (float)local_208._0_4_ * fVar64 + (float)local_158._0_4_ * fVar161;
        fStack_200 = fStack_200 * fVar66 + fStack_150 * fVar170;
        fStack_1fc = fStack_1fc * fVar72 + fStack_14c * fVar37;
        local_218._4_4_ = (float)local_218._4_4_ * fVar65 + (float)local_1d8._4_4_ * fVar164;
        local_218._0_4_ = (float)local_218._0_4_ * fVar64 + (float)local_1d8._0_4_ * fVar161;
        fStack_210 = fStack_210 * fVar66 + fStack_1d0 * fVar170;
        fStack_20c = fStack_20c * fVar72 + fStack_1cc * fVar37;
        local_258._4_4_ = (float)local_258._4_4_ * fVar65 + (float)local_1c8._4_4_ * fVar164;
        local_258._0_4_ = (float)local_258._0_4_ * fVar64 + (float)local_1c8._0_4_ * fVar161;
        uStack_250._0_4_ = (float)uStack_250 * fVar66 + fStack_1c0 * fVar170;
        uStack_250._4_4_ = uStack_250._4_4_ * fVar72 + fStack_1bc * fVar37;
        local_238._4_4_ = (float)local_238._4_4_ * fVar65 + (float)local_228._4_4_ * fVar164;
        local_238._0_4_ = (float)local_238._0_4_ * fVar64 + (float)local_228._0_4_ * fVar161;
        fStack_230 = fStack_230 * fVar66 + fStack_220 * fVar170;
        fStack_22c = fStack_22c * fVar72 + fStack_21c * fVar37;
        local_228._4_4_ = fVar65 * (float)local_288._4_4_ + (float)local_248._4_4_ * fVar164;
        local_228._0_4_ = fVar64 * (float)local_288._0_4_ + (float)local_248._0_4_ * fVar161;
        fStack_220 = fVar66 * fStack_280 + fStack_240 * fVar170;
        fStack_21c = fVar72 * fStack_27c + fStack_23c * fVar37;
      }
      fVar73 = fVar33 * fVar86 + fVar201 * fVar32;
      fVar74 = fVar40 * fVar98 + fVar44 * fVar56;
      fVar82 = fVar167 * fVar99 + fVar54 * fVar236;
      fVar84 = fVar243 * fVar100 + fVar55 * fVar43;
      fVar138 = fVar33 * fVar86 - fVar201 * fVar32;
      fVar143 = fVar40 * fVar98 - fVar44 * fVar56;
      fVar146 = fVar167 * fVar99 - fVar54 * fVar236;
      fVar150 = fVar243 * fVar100 - fVar55 * fVar43;
      fVar160 = fVar86 * fVar86;
      fVar163 = fVar98 * fVar98;
      fVar166 = fVar99 * fVar99;
      fVar169 = fVar100 * fVar100;
      fVar170 = fVar201 * fVar201 - fVar33 * fVar33;
      fVar37 = fVar44 * fVar44 - fVar40 * fVar40;
      fVar66 = fVar54 * fVar54 - fVar167 * fVar167;
      fVar72 = fVar55 * fVar55 - fVar243 * fVar243;
      fVar153 = fVar33 * fVar32 - fVar201 * fVar86;
      fVar157 = fVar40 * fVar56 - fVar44 * fVar98;
      fVar158 = fVar167 * fVar236 - fVar54 * fVar99;
      fVar159 = fVar243 * fVar43 - fVar55 * fVar100;
      fVar161 = fVar201 * fVar86 + fVar33 * fVar32;
      fVar164 = fVar44 * fVar98 + fVar40 * fVar56;
      fVar64 = fVar54 * fVar99 + fVar167 * fVar236;
      fVar65 = fVar55 * fVar100 + fVar243 * fVar43;
      fVar172 = fVar32 * fVar86 + fVar33 * fVar201;
      fVar176 = fVar56 * fVar98 + fVar40 * fVar44;
      fVar177 = fVar236 * fVar99 + fVar167 * fVar54;
      fVar179 = fVar43 * fVar100 + fVar243 * fVar55;
      fVar86 = fVar32 * fVar86 - fVar33 * fVar201;
      fVar98 = fVar56 * fVar98 - fVar40 * fVar44;
      fVar99 = fVar236 * fVar99 - fVar167 * fVar54;
      fVar100 = fVar43 * fVar100 - fVar243 * fVar55;
      fVar32 = fVar32 * fVar32;
      fVar56 = fVar56 * fVar56;
      fVar236 = fVar236 * fVar236;
      fVar43 = fVar43 * fVar43;
      fVar180 = ((fVar201 * fVar201 + fVar33 * fVar33) - fVar160) - fVar32;
      fVar188 = ((fVar44 * fVar44 + fVar40 * fVar40) - fVar163) - fVar56;
      fVar191 = ((fVar54 * fVar54 + fVar167 * fVar167) - fVar166) - fVar236;
      fVar198 = ((fVar55 * fVar55 + fVar243 * fVar243) - fVar169) - fVar43;
      fVar167 = (fVar160 + fVar170) - fVar32;
      fVar243 = (fVar163 + fVar37) - fVar56;
      fVar201 = (fVar166 + fVar66) - fVar236;
      fVar44 = (fVar169 + fVar72) - fVar43;
      fVar32 = (fVar170 - fVar160) + fVar32;
      fVar56 = (fVar37 - fVar163) + fVar56;
      fVar236 = (fVar66 - fVar166) + fVar236;
      fVar43 = (fVar72 - fVar169) + fVar43;
      fVar73 = fVar73 + fVar73;
      fVar74 = fVar74 + fVar74;
      fVar82 = fVar82 + fVar82;
      fVar84 = fVar84 + fVar84;
      fVar153 = fVar153 + fVar153;
      fVar157 = fVar157 + fVar157;
      fVar158 = fVar158 + fVar158;
      fVar159 = fVar159 + fVar159;
      fVar54 = fVar153 * 0.0;
      fVar55 = fVar157 * 0.0;
      fVar66 = fVar158 * 0.0;
      fVar72 = fVar159 * 0.0;
      fVar33 = fVar73 * 0.0;
      fVar170 = fVar74 * 0.0;
      fVar37 = fVar82 * 0.0;
      fVar40 = fVar84 * 0.0;
      fVar160 = fVar33 + fVar54 + fVar180;
      fVar163 = fVar170 + fVar55 + fVar188;
      fVar166 = fVar37 + fVar66 + fVar191;
      fVar169 = fVar40 + fVar72 + fVar198;
      fVar180 = fVar180 * 0.0;
      fVar188 = fVar188 * 0.0;
      fVar191 = fVar191 * 0.0;
      fVar198 = fVar198 * 0.0;
      fVar162 = fVar54 + fVar73 + fVar180;
      fVar168 = fVar55 + fVar74 + fVar188;
      fVar199 = fVar66 + fVar82 + fVar191;
      fVar203 = fVar72 + fVar84 + fVar198;
      fVar180 = fVar180 + fVar153 + fVar33;
      fVar188 = fVar188 + fVar157 + fVar170;
      fVar191 = fVar191 + fVar158 + fVar37;
      fVar198 = fVar198 + fVar159 + fVar40;
      fVar172 = fVar172 + fVar172;
      fVar176 = fVar176 + fVar176;
      fVar177 = fVar177 + fVar177;
      fVar179 = fVar179 + fVar179;
      fVar54 = fVar172 * 0.0;
      fVar55 = fVar176 * 0.0;
      fVar66 = fVar177 * 0.0;
      fVar72 = fVar179 * 0.0;
      fVar33 = fVar167 * 0.0;
      fVar170 = fVar243 * 0.0;
      fVar37 = fVar201 * 0.0;
      fVar40 = fVar44 * 0.0;
      fVar138 = fVar138 + fVar138;
      fVar143 = fVar143 + fVar143;
      fVar146 = fVar146 + fVar146;
      fVar150 = fVar150 + fVar150;
      fVar241 = fVar54 + fVar33 + fVar138;
      fVar144 = fVar55 + fVar170 + fVar143;
      fVar178 = fVar66 + fVar37 + fVar146;
      fVar147 = fVar72 + fVar40 + fVar150;
      fVar138 = fVar138 * 0.0;
      fVar143 = fVar143 * 0.0;
      fVar146 = fVar146 * 0.0;
      fVar150 = fVar150 * 0.0;
      fVar167 = fVar167 + fVar54 + fVar138;
      fVar82 = fVar243 + fVar55 + fVar143;
      fVar153 = fVar201 + fVar66 + fVar146;
      fVar158 = fVar44 + fVar72 + fVar150;
      fVar138 = fVar138 + fVar33 + fVar172;
      fVar143 = fVar143 + fVar170 + fVar176;
      fVar146 = fVar146 + fVar37 + fVar177;
      fVar150 = fVar150 + fVar40 + fVar179;
      fVar86 = fVar86 + fVar86;
      fVar98 = fVar98 + fVar98;
      fVar99 = fVar99 + fVar99;
      fVar100 = fVar100 + fVar100;
      fVar201 = fVar32 * 0.0;
      fVar44 = fVar56 * 0.0;
      fVar54 = fVar236 * 0.0;
      fVar55 = fVar43 * 0.0;
      fVar33 = fVar86 * 0.0;
      fVar170 = fVar98 * 0.0;
      fVar37 = fVar99 * 0.0;
      fVar40 = fVar100 * 0.0;
      fVar161 = fVar161 + fVar161;
      fVar164 = fVar164 + fVar164;
      fVar64 = fVar64 + fVar64;
      fVar65 = fVar65 + fVar65;
      fVar243 = fVar33 + fVar201 + fVar161;
      fVar84 = fVar170 + fVar44 + fVar164;
      fVar157 = fVar37 + fVar54 + fVar64;
      fVar159 = fVar40 + fVar55 + fVar65;
      fVar161 = fVar161 * 0.0;
      fVar164 = fVar164 * 0.0;
      fVar64 = fVar64 * 0.0;
      fVar65 = fVar65 * 0.0;
      fVar148 = fVar201 + fVar86 + fVar161;
      fVar187 = fVar44 + fVar98 + fVar164;
      fVar151 = fVar54 + fVar99 + fVar64;
      fVar152 = fVar55 + fVar100 + fVar65;
      fVar161 = fVar161 + fVar33 + fVar32;
      fVar164 = fVar164 + fVar170 + fVar56;
      fVar64 = fVar64 + fVar37 + fVar236;
      fVar65 = fVar65 + fVar40 + fVar43;
      fVar172 = fVar75 * fVar160 + fVar241 * 0.0 + fVar243 * 0.0;
      fVar176 = fVar80 * fVar163 + fVar144 * 0.0 + fVar84 * 0.0;
      fVar177 = fVar57 * fVar166 + fVar178 * 0.0 + fVar157 * 0.0;
      fVar179 = fVar63 * fVar169 + fVar147 * 0.0 + fVar159 * 0.0;
      fVar190 = fVar75 * fVar162 + fVar167 * 0.0 + fVar148 * 0.0;
      fVar195 = fVar80 * fVar168 + fVar82 * 0.0 + fVar187 * 0.0;
      fVar197 = fVar57 * fVar199 + fVar153 * 0.0 + fVar151 * 0.0;
      fVar239 = fVar63 * fVar203 + fVar158 * 0.0 + fVar152 * 0.0;
      fVar66 = fVar75 * fVar180 + fVar138 * 0.0 + fVar161 * 0.0;
      fVar72 = fVar80 * fVar188 + fVar143 * 0.0 + fVar164 * 0.0;
      fVar73 = fVar57 * fVar191 + fVar146 * 0.0 + fVar64 * 0.0;
      fVar74 = fVar63 * fVar198 + fVar150 * 0.0 + fVar65 * 0.0;
      fVar201 = (float)local_268._0_4_ * fVar160 + (float)local_278._0_4_ * fVar241 + fVar243 * 0.0;
      fVar44 = (float)local_268._4_4_ * fVar163 + (float)local_278._4_4_ * fVar144 + fVar84 * 0.0;
      fVar54 = (float)uStack_260 * fVar166 + fStack_270 * fVar178 + fVar157 * 0.0;
      fVar55 = uStack_260._4_4_ * fVar169 + fStack_26c * fVar147 + fVar159 * 0.0;
      fVar86 = (float)local_268._0_4_ * fVar162 + (float)local_278._0_4_ * fVar167 + fVar148 * 0.0;
      fVar98 = (float)local_268._4_4_ * fVar168 + (float)local_278._4_4_ * fVar82 + fVar187 * 0.0;
      fVar99 = (float)uStack_260 * fVar199 + fStack_270 * fVar153 + fVar151 * 0.0;
      fVar100 = uStack_260._4_4_ * fVar203 + fStack_26c * fVar158 + fVar152 * 0.0;
      fVar237 = (float)local_268._0_4_ * fVar180 + (float)local_278._0_4_ * fVar138 + fVar161 * 0.0;
      fVar240 = (float)local_268._4_4_ * fVar188 + (float)local_278._4_4_ * fVar143 + fVar164 * 0.0;
      fVar242 = (float)uStack_260 * fVar191 + fStack_270 * fVar146 + fVar64 * 0.0;
      fVar244 = uStack_260._4_4_ * fVar198 + fStack_26c * fVar150 + fVar65 * 0.0;
      fVar75 = (float)local_1f8._0_4_ * fVar160 +
               (float)local_208._0_4_ * fVar241 + (float)local_218._0_4_ * fVar243;
      fVar80 = (float)local_1f8._4_4_ * fVar163 +
               (float)local_208._4_4_ * fVar144 + (float)local_218._4_4_ * fVar84;
      fVar57 = fStack_1f0 * fVar166 + fStack_200 * fVar178 + fStack_210 * fVar157;
      fVar63 = fStack_1ec * fVar169 + fStack_1fc * fVar147 + fStack_20c * fVar159;
      fVar186 = (float)local_1f8._0_4_ * fVar162 +
                (float)local_208._0_4_ * fVar167 + (float)local_218._0_4_ * fVar148;
      fVar189 = (float)local_1f8._4_4_ * fVar168 +
                (float)local_208._4_4_ * fVar82 + (float)local_218._4_4_ * fVar187;
      fVar196 = fStack_1f0 * fVar199 + fStack_200 * fVar153 + fStack_210 * fVar151;
      fVar202 = fStack_1ec * fVar203 + fStack_1fc * fVar158 + fStack_20c * fVar152;
      fVar165 = (float)local_1f8._0_4_ * fVar180 +
                (float)local_208._0_4_ * fVar138 + (float)local_218._0_4_ * fVar161;
      fVar171 = (float)local_1f8._4_4_ * fVar188 +
                (float)local_208._4_4_ * fVar143 + (float)local_218._4_4_ * fVar164;
      fVar200 = fStack_1f0 * fVar191 + fStack_200 * fVar146 + fStack_210 * fVar64;
      fVar204 = fStack_1ec * fVar198 + fStack_1fc * fVar150 + fStack_20c * fVar65;
      fVar33 = fVar160 * (float)local_258._0_4_ +
               fVar241 * (float)local_238._0_4_ + fVar243 * (float)local_228._0_4_ +
               (float)local_2b8._0_4_ + 0.0;
      fVar170 = fVar163 * (float)local_258._4_4_ +
                fVar144 * (float)local_238._4_4_ + fVar84 * (float)local_228._4_4_ +
                (float)local_2b8._4_4_ + 0.0;
      fVar40 = fVar166 * (float)uStack_250 + fVar178 * fStack_230 + fVar157 * fStack_220 +
               (float)uStack_2b0 + 0.0;
      fVar236 = fVar169 * uStack_250._4_4_ + fVar147 * fStack_22c + fVar159 * fStack_21c +
                uStack_2b0._4_4_ + 0.0;
      fVar32 = fVar162 * (float)local_258._0_4_ +
               fVar167 * (float)local_238._0_4_ + fVar148 * (float)local_228._0_4_ +
               (float)local_2c8._0_4_ + 0.0;
      fVar37 = fVar168 * (float)local_258._4_4_ +
               fVar82 * (float)local_238._4_4_ + fVar187 * (float)local_228._4_4_ +
               (float)local_2c8._4_4_ + 0.0;
      fVar56 = fVar199 * (float)uStack_250 + fVar153 * fStack_230 + fVar151 * fStack_220 +
               fStack_2c0 + 0.0;
      fVar243 = fVar203 * uStack_250._4_4_ + fVar158 * fStack_22c + fVar152 * fStack_21c +
                fStack_2bc + 0.0;
      fVar161 = fVar180 * (float)local_258._0_4_ +
                fVar138 * (float)local_238._0_4_ + fVar161 * (float)local_228._0_4_ +
                (float)local_298._0_4_ + 0.0;
      fVar164 = fVar188 * (float)local_258._4_4_ +
                fVar143 * (float)local_238._4_4_ + fVar164 * (float)local_228._4_4_ +
                (float)local_298._4_4_ + 0.0;
      fVar167 = fVar191 * (float)uStack_250 + fVar146 * fStack_230 + fVar64 * fStack_220 +
                (float)uStack_290 + 0.0;
      fVar43 = fVar198 * uStack_250._4_4_ + fVar150 * fStack_22c + fVar65 * fStack_21c +
               uStack_290._4_4_ + 0.0;
      auVar207._0_4_ = fVar86 * fVar165 - fVar237 * fVar186;
      auVar207._4_4_ = fVar98 * fVar171 - fVar240 * fVar189;
      auVar207._8_4_ = fVar99 * fVar200 - fVar242 * fVar196;
      auVar207._12_4_ = fVar100 * fVar204 - fVar244 * fVar202;
      auVar105._0_4_ = fVar237 * fVar75 - fVar201 * fVar165;
      auVar105._4_4_ = fVar240 * fVar80 - fVar44 * fVar171;
      auVar105._8_4_ = fVar242 * fVar57 - fVar54 * fVar200;
      auVar105._12_4_ = fVar244 * fVar63 - fVar55 * fVar204;
      auVar59._0_4_ = fVar201 * fVar186 - fVar86 * fVar75;
      auVar59._4_4_ = fVar44 * fVar189 - fVar98 * fVar80;
      auVar59._8_4_ = fVar54 * fVar196 - fVar99 * fVar57;
      auVar59._12_4_ = fVar55 * fVar202 - fVar100 * fVar63;
      auVar183._0_4_ = fVar186 * fVar66 - fVar165 * fVar190;
      auVar183._4_4_ = fVar189 * fVar72 - fVar171 * fVar195;
      auVar183._8_4_ = fVar196 * fVar73 - fVar200 * fVar197;
      auVar183._12_4_ = fVar202 * fVar74 - fVar204 * fVar239;
      auVar193._0_4_ = fVar165 * fVar172 - fVar75 * fVar66;
      auVar193._4_4_ = fVar171 * fVar176 - fVar80 * fVar72;
      auVar193._8_4_ = fVar200 * fVar177 - fVar57 * fVar73;
      auVar193._12_4_ = fVar204 * fVar179 - fVar63 * fVar74;
      auVar79._0_4_ = fVar75 * fVar190 - fVar186 * fVar172;
      auVar79._4_4_ = fVar80 * fVar195 - fVar189 * fVar176;
      auVar79._8_4_ = fVar57 * fVar197 - fVar196 * fVar177;
      auVar79._12_4_ = fVar63 * fVar239 - fVar202 * fVar179;
      auVar51._0_4_ = fVar190 * fVar237 - fVar66 * fVar86;
      auVar51._4_4_ = fVar195 * fVar240 - fVar72 * fVar98;
      auVar51._8_4_ = fVar197 * fVar242 - fVar73 * fVar99;
      auVar51._12_4_ = fVar239 * fVar244 - fVar74 * fVar100;
      auVar218._0_4_ = fVar66 * fVar201 - fVar237 * fVar172;
      auVar218._4_4_ = fVar72 * fVar44 - fVar240 * fVar176;
      auVar218._8_4_ = fVar73 * fVar54 - fVar242 * fVar177;
      auVar218._12_4_ = fVar74 * fVar55 - fVar244 * fVar179;
      auVar140._0_4_ = fVar86 * fVar172 - fVar201 * fVar190;
      auVar140._4_4_ = fVar98 * fVar176 - fVar44 * fVar195;
      auVar140._8_4_ = fVar99 * fVar177 - fVar54 * fVar197;
      auVar140._12_4_ = fVar100 * fVar179 - fVar55 * fVar239;
      auVar155._0_4_ = fVar172 * auVar207._0_4_ + fVar190 * auVar105._0_4_ + fVar66 * auVar59._0_4_;
      auVar155._4_4_ = fVar176 * auVar207._4_4_ + fVar195 * auVar105._4_4_ + fVar72 * auVar59._4_4_;
      auVar155._8_4_ = fVar177 * auVar207._8_4_ + fVar197 * auVar105._8_4_ + fVar73 * auVar59._8_4_;
      auVar155._12_4_ =
           fVar179 * auVar207._12_4_ + fVar239 * auVar105._12_4_ + fVar74 * auVar59._12_4_;
      auVar206 = divps(auVar207,auVar155);
      auVar182 = divps(auVar183,auVar155);
      auVar68 = divps(auVar51,auVar155);
      auVar103 = divps(auVar105,auVar155);
      auVar48 = divps(auVar193,auVar155);
      auVar217 = divps(auVar218,auVar155);
      _local_2c8 = divps(auVar59,auVar155);
      auVar78 = divps(auVar79,auVar155);
      auVar174 = divps(auVar140,auVar155);
      fVar201 = fVar33 * auVar206._0_4_ + fVar32 * auVar103._0_4_ + fVar161 * local_2c8._0_4_;
      fVar44 = fVar170 * auVar206._4_4_ + fVar37 * auVar103._4_4_ + fVar164 * local_2c8._4_4_;
      fVar54 = fVar40 * auVar206._8_4_ + fVar56 * auVar103._8_4_ + fVar167 * local_2c8._8_4_;
      fVar55 = fVar236 * auVar206._12_4_ + fVar243 * auVar103._12_4_ + fVar43 * local_2c8._12_4_;
      fVar75 = fVar33 * auVar182._0_4_ + fVar32 * auVar48._0_4_ + fVar161 * auVar78._0_4_;
      fVar80 = fVar170 * auVar182._4_4_ + fVar37 * auVar48._4_4_ + fVar164 * auVar78._4_4_;
      fVar57 = fVar40 * auVar182._8_4_ + fVar56 * auVar48._8_4_ + fVar167 * auVar78._8_4_;
      fVar63 = fVar236 * auVar182._12_4_ + fVar243 * auVar48._12_4_ + fVar43 * auVar78._12_4_;
      fVar33 = fVar33 * auVar68._0_4_ + fVar32 * auVar217._0_4_ + fVar161 * auVar174._0_4_;
      fVar32 = fVar170 * auVar68._4_4_ + fVar37 * auVar217._4_4_ + fVar164 * auVar174._4_4_;
      fVar161 = fVar40 * auVar68._8_4_ + fVar56 * auVar217._8_4_ + fVar167 * auVar174._8_4_;
      fVar164 = fVar236 * auVar68._12_4_ + fVar243 * auVar217._12_4_ + fVar43 * auVar174._12_4_;
    }
    else {
      BVar7 = (pIVar9->super_Geometry).time_range;
      fVar32 = BVar7.lower;
      auVar46._0_4_ = BVar7.upper - fVar32;
      fVar33 = (pIVar9->super_Geometry).fnumTimeSegments;
      _local_2d8 = ZEXT416((uint)fVar33);
      auVar60._4_4_ = fVar33;
      auVar60._0_4_ = fVar33;
      auVar60._8_4_ = fVar33;
      auVar60._12_4_ = fVar33;
      auVar67._0_4_ = *(float *)(ray + 0x70) - fVar32;
      auVar67._4_4_ = *(float *)(ray + 0x74) - fVar32;
      auVar67._8_4_ = *(float *)(ray + 0x78) - fVar32;
      auVar67._12_4_ = *(float *)(ray + 0x7c) - fVar32;
      auVar46._4_4_ = auVar46._0_4_;
      auVar46._8_4_ = auVar46._0_4_;
      auVar46._12_4_ = auVar46._0_4_;
      auVar68 = divps(auVar67,auVar46);
      auVar69._0_4_ = auVar68._0_4_ * fVar33;
      auVar69._4_4_ = auVar68._4_4_ * fVar33;
      auVar69._8_4_ = auVar68._8_4_ * fVar33;
      auVar69._12_4_ = auVar68._12_4_ * fVar33;
      pRVar27 = context;
      auVar68 = auVar69;
      local_2b8._0_4_ = floorf(auVar69._8_4_);
      uVar25 = SUB84(pRVar27,0);
      local_2b8._4_4_ = extraout_XMM0_Db;
      uStack_2b0._0_4_ = (float)extraout_XMM0_Dc;
      uStack_2b0._4_4_ = (float)extraout_XMM0_Dd;
      local_298._0_4_ = floorf(auVar69._12_4_);
      local_298._4_4_ = extraout_XMM0_Db_00;
      uStack_290._0_4_ = (float)extraout_XMM0_Dc_00;
      uStack_290._4_4_ = (float)extraout_XMM0_Dd_00;
      local_2a8._0_4_ = floorf(auVar69._0_4_);
      local_2a8._4_4_ = extraout_XMM0_Db_01;
      uStack_2a0._0_4_ = (float)extraout_XMM0_Dc_01;
      uStack_2a0._4_4_ = (float)extraout_XMM0_Dd_01;
      fVar32 = floorf(auVar69._4_4_);
      auVar47._4_4_ = fVar32;
      auVar47._0_4_ = local_2a8._0_4_;
      auVar47._8_4_ = local_2b8._0_4_;
      auVar47._12_4_ = local_298._0_4_;
      auVar34._0_4_ = fVar33 + -1.0;
      auVar34._4_4_ = auVar34._0_4_;
      auVar34._8_4_ = auVar34._0_4_;
      auVar34._12_4_ = auVar34._0_4_;
      auVar48 = minps(auVar47,auVar34);
      auVar48 = maxps(auVar48,ZEXT816(0));
      auVar238._0_4_ = auVar69._0_4_ - auVar48._0_4_;
      auVar238._4_4_ = auVar69._4_4_ - auVar48._4_4_;
      auVar238._8_4_ = auVar69._8_4_ - auVar48._8_4_;
      auVar238._12_4_ = auVar69._12_4_ - auVar48._12_4_;
      iVar137 = (int)auVar48._0_4_;
      iVar142 = (int)auVar48._4_4_;
      iVar145 = (int)auVar48._8_4_;
      iVar149 = (int)auVar48._12_4_;
      local_108 = CONCAT44(iVar142,iVar137);
      uStack_100 = (RTCRayQueryContext *)CONCAT44(iVar149,iVar145);
      lVar14 = 0;
      if ((uVar28 & 0xff) != 0) {
        for (; ((uVar28 & 0xff) >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
        }
      }
      iVar8 = *(int *)((long)&local_108 + lVar14 * 4);
      auVar35._0_4_ = -(uint)(iVar8 == iVar137);
      auVar35._4_4_ = -(uint)(iVar8 == iVar142);
      auVar35._8_4_ = -(uint)(iVar8 == iVar145);
      auVar35._12_4_ = -(uint)(iVar8 == iVar149);
      iVar26 = movmskps(uVar25,~auVar35 & auVar45);
      if (iVar26 == 0) {
        pAVar11 = pIVar9->local2world;
        pAVar13 = pAVar11 + iVar8;
        fVar33 = (pAVar13->l).vx.field_0.m128[0];
        fVar32 = (pAVar13->l).vx.field_0.m128[1];
        fVar161 = (pAVar13->l).vx.field_0.m128[2];
        pVVar2 = &pAVar11[iVar8].l.vy;
        fVar164 = (pVVar2->field_0).m128[0];
        fVar170 = (pVVar2->field_0).m128[1];
        fVar37 = (pVVar2->field_0).m128[2];
        pVVar2 = &pAVar11[iVar8].l.vz;
        fVar40 = (pVVar2->field_0).m128[0];
        fVar56 = (pVVar2->field_0).m128[1];
        fVar167 = (pVVar2->field_0).m128[2];
        pVVar2 = &pAVar11[iVar8].p;
        fVar236 = (pVVar2->field_0).m128[0];
        fVar243 = (pVVar2->field_0).m128[1];
        fVar43 = (pVVar2->field_0).m128[2];
        pAVar13 = pAVar11 + (long)iVar8 + 1;
        fVar201 = (pAVar13->l).vx.field_0.m128[0];
        fVar44 = (pAVar13->l).vx.field_0.m128[1];
        fVar54 = (pAVar13->l).vx.field_0.m128[2];
        pVVar2 = &pAVar11[(long)iVar8 + 1].l.vy;
        fVar55 = (pVVar2->field_0).m128[0];
        fVar75 = (pVVar2->field_0).m128[1];
        fVar80 = (pVVar2->field_0).m128[2];
        fVar160 = 1.0 - auVar238._0_4_;
        fVar163 = 1.0 - auVar238._4_4_;
        fVar166 = 1.0 - auVar238._8_4_;
        fVar169 = 1.0 - auVar238._12_4_;
        fVar66 = fVar33 * fVar160 + fVar201 * auVar238._0_4_;
        fVar72 = fVar33 * fVar163 + fVar201 * auVar238._4_4_;
        fVar73 = fVar33 * fVar166 + fVar201 * auVar238._8_4_;
        fVar74 = fVar33 * fVar169 + fVar201 * auVar238._12_4_;
        fVar138 = fVar32 * fVar160 + fVar44 * auVar238._0_4_;
        fVar143 = fVar32 * fVar163 + fVar44 * auVar238._4_4_;
        fVar146 = fVar32 * fVar166 + fVar44 * auVar238._8_4_;
        fVar150 = fVar32 * fVar169 + fVar44 * auVar238._12_4_;
        pVVar2 = &pAVar11[(long)iVar8 + 1].l.vz;
        fVar33 = (pVVar2->field_0).m128[0];
        fVar32 = (pVVar2->field_0).m128[1];
        fVar201 = (pVVar2->field_0).m128[2];
        fVar86 = fVar161 * fVar160 + fVar54 * auVar238._0_4_;
        fVar98 = fVar161 * fVar163 + fVar54 * auVar238._4_4_;
        fVar99 = fVar161 * fVar166 + fVar54 * auVar238._8_4_;
        fVar100 = fVar161 * fVar169 + fVar54 * auVar238._12_4_;
        fVar57 = fVar164 * fVar160 + fVar55 * auVar238._0_4_;
        fVar63 = fVar164 * fVar163 + fVar55 * auVar238._4_4_;
        fVar64 = fVar164 * fVar166 + fVar55 * auVar238._8_4_;
        fVar65 = fVar164 * fVar169 + fVar55 * auVar238._12_4_;
        fVar153 = fVar170 * fVar160 + fVar75 * auVar238._0_4_;
        fVar157 = fVar170 * fVar163 + fVar75 * auVar238._4_4_;
        fVar158 = fVar170 * fVar166 + fVar75 * auVar238._8_4_;
        fVar159 = fVar170 * fVar169 + fVar75 * auVar238._12_4_;
        pVVar2 = &pAVar11[(long)iVar8 + 1].p;
        fVar161 = (pVVar2->field_0).m128[0];
        fVar164 = (pVVar2->field_0).m128[1];
        fVar170 = (pVVar2->field_0).m128[2];
        fVar172 = fVar37 * fVar160 + fVar80 * auVar238._0_4_;
        fVar176 = fVar37 * fVar163 + fVar80 * auVar238._4_4_;
        fVar177 = fVar37 * fVar166 + fVar80 * auVar238._8_4_;
        fVar179 = fVar37 * fVar169 + fVar80 * auVar238._12_4_;
        fVar75 = fVar40 * fVar160 + fVar33 * auVar238._0_4_;
        fVar80 = fVar40 * fVar163 + fVar33 * auVar238._4_4_;
        fVar82 = fVar40 * fVar166 + fVar33 * auVar238._8_4_;
        fVar84 = fVar40 * fVar169 + fVar33 * auVar238._12_4_;
        fVar44 = fVar56 * fVar160 + fVar32 * auVar238._0_4_;
        fVar54 = fVar56 * fVar163 + fVar32 * auVar238._4_4_;
        fVar55 = fVar56 * fVar166 + fVar32 * auVar238._8_4_;
        fVar56 = fVar56 * fVar169 + fVar32 * auVar238._12_4_;
        fVar190 = fVar167 * fVar160 + fVar201 * auVar238._0_4_;
        fVar195 = fVar167 * fVar163 + fVar201 * auVar238._4_4_;
        fVar197 = fVar167 * fVar166 + fVar201 * auVar238._8_4_;
        fVar201 = fVar167 * fVar169 + fVar201 * auVar238._12_4_;
        fVar33 = fVar236 * fVar160 + fVar161 * auVar238._0_4_;
        fVar32 = fVar236 * fVar163 + fVar161 * auVar238._4_4_;
        fVar37 = fVar236 * fVar166 + fVar161 * auVar238._8_4_;
        fVar40 = fVar236 * fVar169 + fVar161 * auVar238._12_4_;
        fVar236 = fVar243 * fVar160 + fVar164 * auVar238._0_4_;
        fVar239 = fVar243 * fVar163 + fVar164 * auVar238._4_4_;
        fVar241 = fVar243 * fVar166 + fVar164 * auVar238._8_4_;
        fVar243 = fVar243 * fVar169 + fVar164 * auVar238._12_4_;
        fVar161 = fVar160 * fVar43 + fVar170 * auVar238._0_4_;
        fVar164 = fVar163 * fVar43 + fVar170 * auVar238._4_4_;
        fVar167 = fVar166 * fVar43 + fVar170 * auVar238._8_4_;
        fVar170 = fVar169 * fVar43 + fVar170 * auVar238._12_4_;
        auVar205._0_4_ = fVar153 * fVar190 - fVar172 * fVar44;
        auVar205._4_4_ = fVar157 * fVar195 - fVar176 * fVar54;
        auVar205._8_4_ = fVar158 * fVar197 - fVar177 * fVar55;
        auVar205._12_4_ = fVar159 * fVar201 - fVar179 * fVar56;
        auVar102._0_4_ = fVar172 * fVar75 - fVar57 * fVar190;
        auVar102._4_4_ = fVar176 * fVar80 - fVar63 * fVar195;
        auVar102._8_4_ = fVar177 * fVar82 - fVar64 * fVar197;
        auVar102._12_4_ = fVar179 * fVar84 - fVar65 * fVar201;
        auVar36._0_4_ = fVar57 * fVar44 - fVar153 * fVar75;
        auVar36._4_4_ = fVar63 * fVar54 - fVar157 * fVar80;
        auVar36._8_4_ = fVar64 * fVar55 - fVar158 * fVar82;
        auVar36._12_4_ = fVar65 * fVar56 - fVar159 * fVar84;
        auVar181._0_4_ = fVar86 * fVar44 - fVar138 * fVar190;
        auVar181._4_4_ = fVar98 * fVar54 - fVar143 * fVar195;
        auVar181._8_4_ = fVar99 * fVar55 - fVar146 * fVar197;
        auVar181._12_4_ = fVar100 * fVar56 - fVar150 * fVar201;
        auVar192._0_4_ = fVar190 * fVar66 - fVar86 * fVar75;
        auVar192._4_4_ = fVar195 * fVar72 - fVar98 * fVar80;
        auVar192._8_4_ = fVar197 * fVar73 - fVar99 * fVar82;
        auVar192._12_4_ = fVar201 * fVar74 - fVar100 * fVar84;
        auVar77._0_4_ = fVar75 * fVar138 - fVar44 * fVar66;
        auVar77._4_4_ = fVar80 * fVar143 - fVar54 * fVar72;
        auVar77._8_4_ = fVar82 * fVar146 - fVar55 * fVar73;
        auVar77._12_4_ = fVar84 * fVar150 - fVar56 * fVar74;
        auVar49._0_4_ = fVar138 * fVar172 - fVar86 * fVar153;
        auVar49._4_4_ = fVar143 * fVar176 - fVar98 * fVar157;
        auVar49._8_4_ = fVar146 * fVar177 - fVar99 * fVar158;
        auVar49._12_4_ = fVar150 * fVar179 - fVar100 * fVar159;
        auVar216._0_4_ = fVar86 * fVar57 - fVar172 * fVar66;
        auVar216._4_4_ = fVar98 * fVar63 - fVar176 * fVar72;
        auVar216._8_4_ = fVar99 * fVar64 - fVar177 * fVar73;
        auVar216._12_4_ = fVar100 * fVar65 - fVar179 * fVar74;
        auVar173._4_4_ = fVar157 * fVar72 - fVar63 * fVar143;
        auVar173._0_4_ = fVar153 * fVar66 - fVar57 * fVar138;
        auVar173._8_4_ = fVar158 * fVar73 - fVar64 * fVar146;
        auVar173._12_4_ = fVar159 * fVar74 - fVar65 * fVar150;
        auVar70._0_4_ = fVar66 * auVar205._0_4_ + fVar138 * auVar102._0_4_ + fVar86 * auVar36._0_4_;
        auVar70._4_4_ = fVar72 * auVar205._4_4_ + fVar143 * auVar102._4_4_ + fVar98 * auVar36._4_4_;
        auVar70._8_4_ = fVar73 * auVar205._8_4_ + fVar146 * auVar102._8_4_ + fVar99 * auVar36._8_4_;
        auVar70._12_4_ =
             fVar74 * auVar205._12_4_ + fVar150 * auVar102._12_4_ + fVar100 * auVar36._12_4_;
        auVar206 = divps(auVar205,auVar70);
        auVar182 = divps(auVar181,auVar70);
        auVar68 = divps(auVar49,auVar70);
        auVar103 = divps(auVar102,auVar70);
        auVar48 = divps(auVar192,auVar70);
        auVar217 = divps(auVar216,auVar70);
        _local_2c8 = divps(auVar36,auVar70);
        auVar78 = divps(auVar77,auVar70);
        auVar174 = divps(auVar173,auVar70);
        fVar201 = fVar33 * auVar206._0_4_ + fVar236 * auVar103._0_4_ + fVar161 * local_2c8._0_4_;
        fVar44 = fVar32 * auVar206._4_4_ + fVar239 * auVar103._4_4_ + fVar164 * local_2c8._4_4_;
        fVar54 = fVar37 * auVar206._8_4_ + fVar241 * auVar103._8_4_ + fVar167 * local_2c8._8_4_;
        fVar55 = fVar40 * auVar206._12_4_ + fVar243 * auVar103._12_4_ + fVar170 * local_2c8._12_4_;
        fVar75 = fVar33 * auVar182._0_4_ + fVar236 * auVar48._0_4_ + fVar161 * auVar78._0_4_;
        fVar80 = fVar32 * auVar182._4_4_ + fVar239 * auVar48._4_4_ + fVar164 * auVar78._4_4_;
        fVar57 = fVar37 * auVar182._8_4_ + fVar241 * auVar48._8_4_ + fVar167 * auVar78._8_4_;
        fVar63 = fVar40 * auVar182._12_4_ + fVar243 * auVar48._12_4_ + fVar170 * auVar78._12_4_;
        fVar33 = fVar33 * auVar68._0_4_ + fVar236 * auVar217._0_4_ + fVar161 * auVar174._0_4_;
        fVar32 = fVar32 * auVar68._4_4_ + fVar239 * auVar217._4_4_ + fVar164 * auVar174._4_4_;
        fVar161 = fVar37 * auVar68._8_4_ + fVar241 * auVar217._8_4_ + fVar167 * auVar174._8_4_;
        fVar164 = fVar40 * auVar68._12_4_ + fVar243 * auVar217._12_4_ + fVar170 * auVar174._12_4_;
      }
      else {
        pAVar13 = pIVar9->local2world;
        auVar78 = auVar45;
        auVar103 = auVar238;
        do {
          lVar14 = 0;
          if ((uVar28 & 0xf) != 0) {
            for (; ((uVar28 & 0xf) >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
            }
          }
          iVar8 = *(int *)((long)&local_108 + (long)(int)lVar14 * 4);
          auVar106._0_4_ = -(uint)(iVar8 == iVar137);
          auVar106._4_4_ = -(uint)(iVar8 == iVar142);
          auVar106._8_4_ = -(uint)(iVar8 == iVar145);
          auVar106._12_4_ = -(uint)(iVar8 == iVar149);
          auVar106 = auVar106 & auVar78;
          pAVar11 = pAVar13 + iVar8;
          uVar25 = *(undefined4 *)&(pAVar11->l).vx.field_0;
          uVar15 = *(undefined4 *)((long)&(pAVar11->l).vx.field_0 + 4);
          uVar16 = *(undefined4 *)((long)&(pAVar11->l).vx.field_0 + 8);
          auVar219._4_4_ = uVar25;
          auVar219._0_4_ = uVar25;
          auVar219._8_4_ = uVar25;
          auVar219._12_4_ = uVar25;
          auVar48 = ~auVar106 & auVar48 | auVar219 & auVar106;
          auVar220._4_4_ = uVar15;
          auVar220._0_4_ = uVar15;
          auVar220._8_4_ = uVar15;
          auVar220._12_4_ = uVar15;
          _local_268 = ~auVar106 & _local_268 | auVar220 & auVar106;
          auVar208._4_4_ = uVar16;
          auVar208._0_4_ = uVar16;
          auVar208._8_4_ = uVar16;
          auVar208._12_4_ = uVar16;
          _local_298 = ~auVar106 & _local_298 | auVar208 & auVar106;
          pVVar2 = &pAVar13[iVar8].l.vy;
          uVar25 = *(undefined4 *)&pVVar2->field_0;
          uVar15 = *(undefined4 *)((long)&pVVar2->field_0 + 4);
          uVar16 = *(undefined4 *)((long)&pVVar2->field_0 + 8);
          auVar221._4_4_ = uVar25;
          auVar221._0_4_ = uVar25;
          auVar221._8_4_ = uVar25;
          auVar221._12_4_ = uVar25;
          _local_238 = ~auVar106 & _local_238 | auVar221 & auVar106;
          auVar222._4_4_ = uVar15;
          auVar222._0_4_ = uVar15;
          auVar222._8_4_ = uVar15;
          auVar222._12_4_ = uVar15;
          _local_258 = ~auVar106 & _local_258 | auVar222 & auVar106;
          auVar209._4_4_ = uVar16;
          auVar209._0_4_ = uVar16;
          auVar209._8_4_ = uVar16;
          auVar209._12_4_ = uVar16;
          _local_278 = ~auVar106 & _local_278 | auVar209 & auVar106;
          pVVar2 = &pAVar13[iVar8].l.vz;
          uVar25 = *(undefined4 *)&pVVar2->field_0;
          uVar15 = *(undefined4 *)((long)&pVVar2->field_0 + 4);
          uVar16 = *(undefined4 *)((long)&pVVar2->field_0 + 8);
          auVar223._4_4_ = uVar25;
          auVar223._0_4_ = uVar25;
          auVar223._8_4_ = uVar25;
          auVar223._12_4_ = uVar25;
          _local_2b8 = ~auVar106 & _local_2b8 | auVar223 & auVar106;
          auVar224._4_4_ = uVar15;
          auVar224._0_4_ = uVar15;
          auVar224._8_4_ = uVar15;
          auVar224._12_4_ = uVar15;
          _local_288 = ~auVar106 & _local_288 | auVar224 & auVar106;
          auVar210._4_4_ = uVar16;
          auVar210._0_4_ = uVar16;
          auVar210._8_4_ = uVar16;
          auVar210._12_4_ = uVar16;
          auVar60 = ~auVar106 & auVar60 | auVar210 & auVar106;
          pVVar2 = &pAVar13[iVar8].p;
          uVar25 = *(undefined4 *)&pVVar2->field_0;
          uVar15 = *(undefined4 *)((long)&pVVar2->field_0 + 4);
          uVar16 = *(undefined4 *)((long)&pVVar2->field_0 + 8);
          auVar225._4_4_ = uVar25;
          auVar225._0_4_ = uVar25;
          auVar225._8_4_ = uVar25;
          auVar225._12_4_ = uVar25;
          _local_2d8 = ~auVar106 & _local_2d8 | auVar225 & auVar106;
          auVar226._4_4_ = uVar15;
          auVar226._0_4_ = uVar15;
          auVar226._8_4_ = uVar15;
          auVar226._12_4_ = uVar15;
          _local_2a8 = ~auVar106 & _local_2a8 | auVar226 & auVar106;
          auVar211._4_4_ = uVar16;
          auVar211._0_4_ = uVar16;
          auVar211._8_4_ = uVar16;
          auVar211._12_4_ = uVar16;
          _local_1f8 = ~auVar106 & _local_1f8 | auVar211 & auVar106;
          pAVar11 = pAVar13 + (long)iVar8 + 1;
          uVar25 = *(undefined4 *)&(pAVar11->l).vx.field_0;
          uVar15 = *(undefined4 *)((long)&(pAVar11->l).vx.field_0 + 4);
          uVar16 = *(undefined4 *)((long)&(pAVar11->l).vx.field_0 + 8);
          auVar227._4_4_ = uVar25;
          auVar227._0_4_ = uVar25;
          auVar227._8_4_ = uVar25;
          auVar227._12_4_ = uVar25;
          in_XMM4 = ~auVar106 & in_XMM4 | auVar227 & auVar106;
          auVar228._4_4_ = uVar15;
          auVar228._0_4_ = uVar15;
          auVar228._8_4_ = uVar15;
          auVar228._12_4_ = uVar15;
          in_XMM12 = ~auVar106 & in_XMM12 | auVar228 & auVar106;
          auVar212._4_4_ = uVar16;
          auVar212._0_4_ = uVar16;
          auVar212._8_4_ = uVar16;
          auVar212._12_4_ = uVar16;
          in_XMM10 = ~auVar106 & in_XMM10 | auVar212 & auVar106;
          pVVar2 = &pAVar13[(long)iVar8 + 1].l.vy;
          uVar25 = *(undefined4 *)&pVVar2->field_0;
          uVar15 = *(undefined4 *)((long)&pVVar2->field_0 + 4);
          uVar16 = *(undefined4 *)((long)&pVVar2->field_0 + 8);
          auVar229._4_4_ = uVar25;
          auVar229._0_4_ = uVar25;
          auVar229._8_4_ = uVar25;
          auVar229._12_4_ = uVar25;
          in_XMM9 = ~auVar106 & in_XMM9 | auVar229 & auVar106;
          auVar230._4_4_ = uVar15;
          auVar230._0_4_ = uVar15;
          auVar230._8_4_ = uVar15;
          auVar230._12_4_ = uVar15;
          in_XMM8 = ~auVar106 & in_XMM8 | auVar230 & auVar106;
          auVar213._4_4_ = uVar16;
          auVar213._0_4_ = uVar16;
          auVar213._8_4_ = uVar16;
          auVar213._12_4_ = uVar16;
          in_XMM5 = ~auVar106 & in_XMM5 | auVar213 & auVar106;
          pVVar2 = &pAVar13[(long)iVar8 + 1].l.vz;
          uVar25 = *(undefined4 *)&pVVar2->field_0;
          uVar15 = *(undefined4 *)((long)&pVVar2->field_0 + 4);
          uVar16 = *(undefined4 *)((long)&pVVar2->field_0 + 8);
          auVar231._4_4_ = uVar25;
          auVar231._0_4_ = uVar25;
          auVar231._8_4_ = uVar25;
          auVar231._12_4_ = uVar25;
          auVar68 = ~auVar106 & auVar68 | auVar231 & auVar106;
          auVar232._4_4_ = uVar15;
          auVar232._0_4_ = uVar15;
          auVar232._8_4_ = uVar15;
          auVar232._12_4_ = uVar15;
          auVar103 = ~auVar106 & auVar103 | auVar232 & auVar106;
          auVar214._4_4_ = uVar16;
          auVar214._0_4_ = uVar16;
          auVar214._8_4_ = uVar16;
          auVar214._12_4_ = uVar16;
          _local_248 = ~auVar106 & _local_248 | auVar214 & auVar106;
          pVVar2 = &pAVar13[(long)iVar8 + 1].p;
          uVar25 = *(undefined4 *)&pVVar2->field_0;
          uVar15 = *(undefined4 *)((long)&pVVar2->field_0 + 4);
          uVar16 = *(undefined4 *)((long)&pVVar2->field_0 + 8);
          auVar233._4_4_ = uVar25;
          auVar233._0_4_ = uVar25;
          auVar233._8_4_ = uVar25;
          auVar233._12_4_ = uVar25;
          _local_218 = ~auVar106 & _local_218 | auVar233 & auVar106;
          auVar234._4_4_ = uVar15;
          auVar234._0_4_ = uVar15;
          auVar234._8_4_ = uVar15;
          auVar234._12_4_ = uVar15;
          _local_208 = ~auVar106 & _local_208 | auVar234 & auVar106;
          auVar78 = auVar78 ^ auVar106;
          auVar184._4_4_ = uVar16;
          auVar184._0_4_ = uVar16;
          auVar184._8_4_ = uVar16;
          auVar184._12_4_ = uVar16;
          in_XMM13 = ~auVar106 & in_XMM13 | auVar184 & auVar106;
          uVar28 = movmskps(uVar28,auVar78);
        } while (uVar28 != 0);
        fVar153 = 1.0 - auVar238._0_4_;
        fVar157 = 1.0 - auVar238._4_4_;
        fVar158 = 1.0 - auVar238._8_4_;
        fVar159 = 1.0 - auVar238._12_4_;
        fVar73 = auVar48._0_4_ * fVar153 + in_XMM4._0_4_ * auVar238._0_4_;
        fVar74 = auVar48._4_4_ * fVar157 + in_XMM4._4_4_ * auVar238._4_4_;
        fVar82 = auVar48._8_4_ * fVar158 + in_XMM4._8_4_ * auVar238._8_4_;
        fVar84 = auVar48._12_4_ * fVar159 + in_XMM4._12_4_ * auVar238._12_4_;
        fVar64 = (float)local_268._0_4_ * fVar153 + in_XMM12._0_4_ * auVar238._0_4_;
        fVar65 = (float)local_268._4_4_ * fVar157 + in_XMM12._4_4_ * auVar238._4_4_;
        fVar66 = (float)uStack_260 * fVar158 + in_XMM12._8_4_ * auVar238._8_4_;
        fVar72 = uStack_260._4_4_ * fVar159 + in_XMM12._12_4_ * auVar238._12_4_;
        fVar33 = (float)local_298._0_4_ * fVar153 + in_XMM10._0_4_ * auVar238._0_4_;
        fVar164 = (float)local_298._4_4_ * fVar157 + in_XMM10._4_4_ * auVar238._4_4_;
        fVar40 = (float)uStack_290 * fVar158 + in_XMM10._8_4_ * auVar238._8_4_;
        fVar236 = uStack_290._4_4_ * fVar159 + in_XMM10._12_4_ * auVar238._12_4_;
        fVar138 = (float)local_238._0_4_ * fVar153 + in_XMM9._0_4_ * auVar238._0_4_;
        fVar143 = (float)local_238._4_4_ * fVar157 + in_XMM9._4_4_ * auVar238._4_4_;
        fVar146 = fStack_230 * fVar158 + in_XMM9._8_4_ * auVar238._8_4_;
        fVar150 = fStack_22c * fVar159 + in_XMM9._12_4_ * auVar238._12_4_;
        fVar32 = (float)local_258._0_4_ * fVar153 + in_XMM8._0_4_ * auVar238._0_4_;
        fVar170 = (float)local_258._4_4_ * fVar157 + in_XMM8._4_4_ * auVar238._4_4_;
        fVar56 = (float)uStack_250 * fVar158 + in_XMM8._8_4_ * auVar238._8_4_;
        fVar243 = uStack_250._4_4_ * fVar159 + in_XMM8._12_4_ * auVar238._12_4_;
        fVar86 = (float)local_278._0_4_ * fVar153 + in_XMM5._0_4_ * auVar238._0_4_;
        fVar98 = (float)local_278._4_4_ * fVar157 + in_XMM5._4_4_ * auVar238._4_4_;
        fVar99 = fStack_270 * fVar158 + in_XMM5._8_4_ * auVar238._8_4_;
        fVar100 = fStack_26c * fVar159 + in_XMM5._12_4_ * auVar238._12_4_;
        fVar161 = (float)local_2b8._0_4_ * fVar153 + auVar68._0_4_ * auVar238._0_4_;
        fVar37 = (float)local_2b8._4_4_ * fVar157 + auVar68._4_4_ * auVar238._4_4_;
        fVar167 = (float)uStack_2b0 * fVar158 + auVar68._8_4_ * auVar238._8_4_;
        fVar43 = uStack_2b0._4_4_ * fVar159 + auVar68._12_4_ * auVar238._12_4_;
        fVar201 = (float)local_288._0_4_ * fVar153 + auVar103._0_4_ * auVar238._0_4_;
        fVar44 = (float)local_288._4_4_ * fVar157 + auVar103._4_4_ * auVar238._4_4_;
        fVar54 = fStack_280 * fVar158 + auVar103._8_4_ * auVar238._8_4_;
        fVar55 = fStack_27c * fVar159 + auVar103._12_4_ * auVar238._12_4_;
        fVar75 = auVar60._0_4_ * fVar153 + (float)local_248._0_4_ * auVar238._0_4_;
        fVar80 = auVar60._4_4_ * fVar157 + (float)local_248._4_4_ * auVar238._4_4_;
        fVar57 = auVar60._8_4_ * fVar158 + fStack_240 * auVar238._8_4_;
        fVar63 = auVar60._12_4_ * fVar159 + fStack_23c * auVar238._12_4_;
        fVar172 = (float)local_2d8._0_4_ * fVar153 + (float)local_218._0_4_ * auVar238._0_4_;
        fVar176 = (float)local_2d8._4_4_ * fVar157 + (float)local_218._4_4_ * auVar238._4_4_;
        fVar177 = (float)uStack_2d0 * fVar158 + fStack_210 * auVar238._8_4_;
        fVar179 = uStack_2d0._4_4_ * fVar159 + fStack_20c * auVar238._12_4_;
        fVar160 = (float)local_2a8._0_4_ * fVar153 + (float)local_208._0_4_ * auVar238._0_4_;
        fVar163 = (float)local_2a8._4_4_ * fVar157 + (float)local_208._4_4_ * auVar238._4_4_;
        fVar166 = (float)uStack_2a0 * fVar158 + fStack_200 * auVar238._8_4_;
        fVar169 = uStack_2a0._4_4_ * fVar159 + fStack_1fc * auVar238._12_4_;
        fVar153 = fVar153 * (float)local_1f8._0_4_ + in_XMM13._0_4_ * auVar238._0_4_;
        fVar157 = fVar157 * (float)local_1f8._4_4_ + in_XMM13._4_4_ * auVar238._4_4_;
        fVar158 = fVar158 * fStack_1f0 + in_XMM13._8_4_ * auVar238._8_4_;
        fVar159 = fVar159 * fStack_1ec + in_XMM13._12_4_ * auVar238._12_4_;
        auVar215._0_4_ = fVar32 * fVar75 - fVar86 * fVar201;
        auVar215._4_4_ = fVar170 * fVar80 - fVar98 * fVar44;
        auVar215._8_4_ = fVar56 * fVar57 - fVar99 * fVar54;
        auVar215._12_4_ = fVar243 * fVar63 - fVar100 * fVar55;
        auVar107._0_4_ = fVar86 * fVar161 - fVar138 * fVar75;
        auVar107._4_4_ = fVar98 * fVar37 - fVar143 * fVar80;
        auVar107._8_4_ = fVar99 * fVar167 - fVar146 * fVar57;
        auVar107._12_4_ = fVar100 * fVar43 - fVar150 * fVar63;
        auVar89._0_4_ = fVar138 * fVar201 - fVar32 * fVar161;
        auVar89._4_4_ = fVar143 * fVar44 - fVar170 * fVar37;
        auVar89._8_4_ = fVar146 * fVar54 - fVar56 * fVar167;
        auVar89._12_4_ = fVar150 * fVar55 - fVar243 * fVar43;
        auVar185._0_4_ = fVar33 * fVar201 - fVar64 * fVar75;
        auVar185._4_4_ = fVar164 * fVar44 - fVar65 * fVar80;
        auVar185._8_4_ = fVar40 * fVar54 - fVar66 * fVar57;
        auVar185._12_4_ = fVar236 * fVar55 - fVar72 * fVar63;
        auVar61._0_4_ = fVar75 * fVar73 - fVar33 * fVar161;
        auVar61._4_4_ = fVar80 * fVar74 - fVar164 * fVar37;
        auVar61._8_4_ = fVar57 * fVar82 - fVar40 * fVar167;
        auVar61._12_4_ = fVar63 * fVar84 - fVar236 * fVar43;
        local_2b8._4_4_ = fVar37 * fVar65 - fVar44 * fVar74;
        local_2b8._0_4_ = fVar161 * fVar64 - fVar201 * fVar73;
        uStack_2b0._0_4_ = fVar167 * fVar66 - fVar54 * fVar82;
        uStack_2b0._4_4_ = fVar43 * fVar72 - fVar55 * fVar84;
        auVar52._0_4_ = fVar64 * fVar86 - fVar33 * fVar32;
        auVar52._4_4_ = fVar65 * fVar98 - fVar164 * fVar170;
        auVar52._8_4_ = fVar66 * fVar99 - fVar40 * fVar56;
        auVar52._12_4_ = fVar72 * fVar100 - fVar236 * fVar243;
        auVar235._0_4_ = fVar33 * fVar138 - fVar86 * fVar73;
        auVar235._4_4_ = fVar164 * fVar143 - fVar98 * fVar74;
        auVar235._8_4_ = fVar40 * fVar146 - fVar99 * fVar82;
        auVar235._12_4_ = fVar236 * fVar150 - fVar100 * fVar84;
        auVar175._4_4_ = fVar170 * fVar74 - fVar143 * fVar65;
        auVar175._0_4_ = fVar32 * fVar73 - fVar138 * fVar64;
        auVar175._8_4_ = fVar56 * fVar82 - fVar146 * fVar66;
        auVar175._12_4_ = fVar243 * fVar84 - fVar150 * fVar72;
        auVar141._0_4_ = fVar73 * auVar215._0_4_ + fVar64 * auVar107._0_4_ + fVar33 * auVar89._0_4_;
        auVar141._4_4_ = fVar74 * auVar215._4_4_ + fVar65 * auVar107._4_4_ + fVar164 * auVar89._4_4_
        ;
        auVar141._8_4_ = fVar82 * auVar215._8_4_ + fVar66 * auVar107._8_4_ + fVar40 * auVar89._8_4_;
        auVar141._12_4_ =
             fVar84 * auVar215._12_4_ + fVar72 * auVar107._12_4_ + fVar236 * auVar89._12_4_;
        auVar206 = divps(auVar215,auVar141);
        auVar182 = divps(auVar185,auVar141);
        auVar68 = divps(auVar52,auVar141);
        auVar103 = divps(auVar107,auVar141);
        auVar48 = divps(auVar61,auVar141);
        auVar217 = divps(auVar235,auVar141);
        _local_2c8 = divps(auVar89,auVar141);
        auVar78 = divps(_local_2b8,auVar141);
        auVar174 = divps(auVar175,auVar141);
        fVar201 = fVar172 * auVar206._0_4_ + fVar160 * auVar103._0_4_ + fVar153 * local_2c8._0_4_;
        fVar44 = fVar176 * auVar206._4_4_ + fVar163 * auVar103._4_4_ + fVar157 * local_2c8._4_4_;
        fVar54 = fVar177 * auVar206._8_4_ + fVar166 * auVar103._8_4_ + fVar158 * local_2c8._8_4_;
        fVar55 = fVar179 * auVar206._12_4_ + fVar169 * auVar103._12_4_ + fVar159 * local_2c8._12_4_;
        fVar75 = fVar172 * auVar182._0_4_ + fVar160 * auVar48._0_4_ + fVar153 * auVar78._0_4_;
        fVar80 = fVar176 * auVar182._4_4_ + fVar163 * auVar48._4_4_ + fVar157 * auVar78._4_4_;
        fVar57 = fVar177 * auVar182._8_4_ + fVar166 * auVar48._8_4_ + fVar158 * auVar78._8_4_;
        fVar63 = fVar179 * auVar182._12_4_ + fVar169 * auVar48._12_4_ + fVar159 * auVar78._12_4_;
        fVar33 = fVar172 * auVar68._0_4_ + fVar160 * auVar217._0_4_ + fVar153 * auVar174._0_4_;
        fVar32 = fVar176 * auVar68._4_4_ + fVar163 * auVar217._4_4_ + fVar157 * auVar174._4_4_;
        fVar161 = fVar177 * auVar68._8_4_ + fVar166 * auVar217._8_4_ + fVar158 * auVar174._8_4_;
        fVar164 = fVar179 * auVar68._12_4_ + fVar169 * auVar217._12_4_ + fVar159 * auVar174._12_4_;
      }
    }
    pRVar1 = ray + 0x10;
    fVar170 = *(float *)pRVar1;
    fVar37 = *(float *)(ray + 0x14);
    fVar40 = *(float *)(ray + 0x18);
    auVar19 = *(undefined1 (*) [12])pRVar1;
    fVar56 = *(float *)(ray + 0x1c);
    auVar90 = *(undefined1 (*) [16])pRVar1;
    pRVar1 = ray + 0x20;
    fVar167 = *(float *)pRVar1;
    fVar236 = *(float *)(ray + 0x24);
    fVar243 = *(float *)(ray + 0x28);
    auVar20 = *(undefined1 (*) [12])pRVar1;
    fVar43 = *(float *)(ray + 0x2c);
    auVar91 = *(undefined1 (*) [16])pRVar1;
    fVar64 = *(float *)ray;
    fVar65 = *(float *)(ray + 4);
    fVar66 = *(float *)(ray + 8);
    auVar21 = *(undefined1 (*) [12])ray;
    fVar72 = *(float *)(ray + 0xc);
    auVar92 = *(undefined1 (*) [16])ray;
    pRVar1 = ray + 0x40;
    fVar73 = *(float *)pRVar1;
    fVar74 = *(float *)(ray + 0x44);
    fVar82 = *(float *)(ray + 0x48);
    auVar24 = *(undefined1 (*) [12])pRVar1;
    fVar84 = *(float *)(ray + 0x4c);
    auVar95 = *(undefined1 (*) [16])pRVar1;
    pRVar1 = ray + 0x50;
    fVar86 = *(float *)pRVar1;
    fVar98 = *(float *)(ray + 0x54);
    fVar99 = *(float *)(ray + 0x58);
    auVar23 = *(undefined1 (*) [12])pRVar1;
    fVar100 = *(float *)(ray + 0x5c);
    auVar94 = *(undefined1 (*) [16])pRVar1;
    pRVar1 = ray + 0x60;
    fVar138 = *(float *)pRVar1;
    fVar143 = *(float *)(ray + 100);
    fVar146 = *(float *)(ray + 0x68);
    auVar22 = *(undefined1 (*) [12])pRVar1;
    fVar150 = *(float *)(ray + 0x6c);
    auVar93 = *(undefined1 (*) [16])pRVar1;
    *(float *)ray =
         auVar206._0_4_ * fVar64 +
         auVar103._0_4_ * fVar170 + (float)local_2c8._0_4_ * fVar167 + -fVar201;
    *(float *)(ray + 4) =
         auVar206._4_4_ * fVar65 +
         auVar103._4_4_ * fVar37 + (float)local_2c8._4_4_ * fVar236 + -fVar44;
    *(float *)(ray + 8) =
         auVar206._8_4_ * fVar66 + auVar103._8_4_ * fVar40 + fStack_2c0 * fVar243 + -fVar54;
    *(float *)(ray + 0xc) =
         auVar206._12_4_ * fVar72 + auVar103._12_4_ * fVar56 + fStack_2bc * fVar43 + -fVar55;
    *(float *)(ray + 0x10) =
         auVar182._0_4_ * fVar64 + auVar48._0_4_ * fVar170 + auVar78._0_4_ * fVar167 + -fVar75;
    *(float *)(ray + 0x14) =
         auVar182._4_4_ * fVar65 + auVar48._4_4_ * fVar37 + auVar78._4_4_ * fVar236 + -fVar80;
    *(float *)(ray + 0x18) =
         auVar182._8_4_ * fVar66 + auVar48._8_4_ * fVar40 + auVar78._8_4_ * fVar243 + -fVar57;
    *(float *)(ray + 0x1c) =
         auVar182._12_4_ * fVar72 + auVar48._12_4_ * fVar56 + auVar78._12_4_ * fVar43 + -fVar63;
    *(float *)(ray + 0x20) =
         auVar68._0_4_ * fVar64 + auVar217._0_4_ * fVar170 + auVar174._0_4_ * fVar167 + -fVar33;
    *(float *)(ray + 0x24) =
         auVar68._4_4_ * fVar65 + auVar217._4_4_ * fVar37 + auVar174._4_4_ * fVar236 + -fVar32;
    *(float *)(ray + 0x28) =
         auVar68._8_4_ * fVar66 + auVar217._8_4_ * fVar40 + auVar174._8_4_ * fVar243 + -fVar161;
    *(float *)(ray + 0x2c) =
         auVar68._12_4_ * fVar72 + auVar217._12_4_ * fVar56 + auVar174._12_4_ * fVar43 + -fVar164;
    *(float *)(ray + 0x40) =
         auVar206._0_4_ * fVar73 + auVar103._0_4_ * fVar86 + (float)local_2c8._0_4_ * fVar138;
    *(float *)(ray + 0x44) =
         auVar206._4_4_ * fVar74 + auVar103._4_4_ * fVar98 + (float)local_2c8._4_4_ * fVar143;
    *(float *)(ray + 0x48) =
         auVar206._8_4_ * fVar82 + auVar103._8_4_ * fVar99 + fStack_2c0 * fVar146;
    *(float *)(ray + 0x4c) =
         auVar206._12_4_ * fVar84 + auVar103._12_4_ * fVar100 + fStack_2bc * fVar150;
    *(float *)(ray + 0x50) =
         auVar182._0_4_ * fVar73 + auVar48._0_4_ * fVar86 + auVar78._0_4_ * fVar138;
    *(float *)(ray + 0x54) =
         auVar182._4_4_ * fVar74 + auVar48._4_4_ * fVar98 + auVar78._4_4_ * fVar143;
    *(float *)(ray + 0x58) =
         auVar182._8_4_ * fVar82 + auVar48._8_4_ * fVar99 + auVar78._8_4_ * fVar146;
    *(float *)(ray + 0x5c) =
         auVar182._12_4_ * fVar84 + auVar48._12_4_ * fVar100 + auVar78._12_4_ * fVar150;
    *(float *)(ray + 0x60) =
         auVar68._0_4_ * fVar73 + auVar217._0_4_ * fVar86 + auVar174._0_4_ * fVar138;
    *(float *)(ray + 100) =
         auVar68._4_4_ * fVar74 + auVar217._4_4_ * fVar98 + auVar174._4_4_ * fVar143;
    *(float *)(ray + 0x68) =
         auVar68._8_4_ * fVar82 + auVar217._8_4_ * fVar99 + auVar174._8_4_ * fVar146;
    *(float *)(ray + 0x6c) =
         auVar68._12_4_ * fVar84 + auVar217._12_4_ * fVar100 + auVar174._12_4_ * fVar150;
    local_108 = *(long *)&(pIVar9->super_Geometry).field_0x58;
    local_f8 = context->args;
    local_128 = auVar45._0_8_;
    uStack_120 = auVar45._8_8_;
    local_38 = local_128;
    uStack_30 = uStack_120;
    uStack_100 = pRVar10;
    (**(code **)(local_108 + 0x98))(&local_38,local_108 + 0x58,ray);
    local_298 = auVar21._0_8_;
    uStack_290 = auVar92._8_8_;
    *(undefined1 (*) [8])ray = local_298;
    *(undefined8 *)(ray + 8) = uStack_290;
    local_2b8 = auVar19._0_8_;
    uStack_2b0 = auVar90._8_8_;
    *(undefined1 (*) [8])(ray + 0x10) = local_2b8;
    *(undefined8 *)(ray + 0x18) = uStack_2b0;
    local_2d8 = auVar20._0_8_;
    uStack_2d0 = auVar91._8_8_;
    *(undefined1 (*) [8])(ray + 0x20) = local_2d8;
    *(undefined8 *)(ray + 0x28) = uStack_2d0;
    local_268 = auVar24._0_8_;
    uStack_260 = auVar95._8_8_;
    *(undefined1 (*) [8])(ray + 0x40) = local_268;
    *(undefined8 *)(ray + 0x48) = uStack_260;
    local_258 = auVar23._0_8_;
    uStack_250 = auVar94._8_8_;
    *(undefined1 (*) [8])(ray + 0x50) = local_258;
    *(undefined8 *)(ray + 0x58) = uStack_250;
    local_2a8 = auVar22._0_8_;
    uStack_2a0 = auVar93._8_8_;
    *(undefined1 (*) [8])(ray + 0x60) = local_2a8;
    *(undefined8 *)(ray + 0x68) = uStack_2a0;
    pRVar10->instID[0] = 0xffffffff;
    pRVar10->instPrimID[0] = 0xffffffff;
  }
  return;
}

Assistant:

void InstanceIntersectorKMB<K>::intersect(const vbool<K>& valid_i, const Precalculations& pre, RayHitK<K>& ray, RayQueryContext* context, const InstancePrimitive& prim)
    {
      vbool<K> valid = valid_i;
      const Instance* instance = prim.instance;
      
      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      valid &= (ray.mask & instance->mask) != 0;
      if (none(valid)) return;
#endif
        
      RTCRayQueryContext* user_context = context->user;
      if (likely(instance_id_stack::push(user_context, prim.instID_, 0)))
      {
        AffineSpace3vf<K> world2local = instance->getWorld2Local<K>(valid, ray.time());
        const Vec3vf<K> ray_org = ray.org;
        const Vec3vf<K> ray_dir = ray.dir;
        ray.org = xfmPoint(world2local, ray_org);
        ray.dir = xfmVector(world2local, ray_dir);
        RayQueryContext newcontext((Scene*)instance->object, user_context, context->args);
        instance->object->intersectors.intersect(valid, ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        instance_id_stack::pop(user_context);
      }
    }